

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  bool bVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  long lVar56;
  byte bVar57;
  uint uVar58;
  ulong uVar59;
  ulong uVar60;
  float fVar61;
  vint4 bi_2;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined4 uVar62;
  undefined1 auVar68 [16];
  float fVar63;
  undefined1 auVar72 [32];
  undefined8 extraout_XMM1_Qa;
  float fVar95;
  vint4 bi_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar94;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 extraout_var [56];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  vint4 ai_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  vint4 ai;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar134;
  float fVar150;
  float fVar151;
  vint4 bi;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar152;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar149 [32];
  float fVar156;
  undefined8 uVar157;
  float fVar178;
  vfloat4 b0_1;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar176;
  float fVar179;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar177;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  vint4 ai_1;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  vfloat4 a0_2;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  vfloat4 a0_3;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  float fVar242;
  float fVar254;
  float fVar255;
  vfloat4 a0_1;
  undefined1 auVar243 [16];
  float fVar256;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  vfloat4 a0;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar274 [16];
  undefined1 auVar278 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_780 [16];
  float local_720;
  float fStack_71c;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 local_610 [8];
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  uint auStack_4f0 [4];
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar55;
  undefined1 auVar93 [64];
  undefined1 auVar117 [32];
  
  PVar3 = prim[1];
  uVar60 = (ulong)(byte)PVar3;
  fVar61 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar125._0_4_ = fVar61 * auVar9._0_4_;
  auVar125._4_4_ = fVar61 * auVar9._4_4_;
  auVar125._8_4_ = fVar61 * auVar9._8_4_;
  auVar125._12_4_ = fVar61 * auVar9._12_4_;
  auVar135._0_4_ = fVar61 * auVar10._0_4_;
  auVar135._4_4_ = fVar61 * auVar10._4_4_;
  auVar135._8_4_ = fVar61 * auVar10._8_4_;
  auVar135._12_4_ = fVar61 * auVar10._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar269 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar269 = vcvtdq2ps_avx(auVar269);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar60 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar54 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + uVar60 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  uVar54 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar265._4_4_ = auVar135._0_4_;
  auVar265._0_4_ = auVar135._0_4_;
  auVar265._8_4_ = auVar135._0_4_;
  auVar265._12_4_ = auVar135._0_4_;
  auVar74 = vshufps_avx(auVar135,auVar135,0x55);
  auVar203 = vshufps_avx(auVar135,auVar135,0xaa);
  fVar61 = auVar203._0_4_;
  auVar234._0_4_ = fVar61 * auVar269._0_4_;
  fVar134 = auVar203._4_4_;
  auVar234._4_4_ = fVar134 * auVar269._4_4_;
  fVar150 = auVar203._8_4_;
  auVar234._8_4_ = fVar150 * auVar269._8_4_;
  fVar151 = auVar203._12_4_;
  auVar234._12_4_ = fVar151 * auVar269._12_4_;
  auVar224._0_4_ = auVar13._0_4_ * fVar61;
  auVar224._4_4_ = auVar13._4_4_ * fVar134;
  auVar224._8_4_ = auVar13._8_4_ * fVar150;
  auVar224._12_4_ = auVar13._12_4_ * fVar151;
  auVar196._0_4_ = auVar96._0_4_ * fVar61;
  auVar196._4_4_ = auVar96._4_4_ * fVar134;
  auVar196._8_4_ = auVar96._8_4_ * fVar150;
  auVar196._12_4_ = auVar96._12_4_ * fVar151;
  auVar203 = vfmadd231ps_fma(auVar234,auVar74,auVar10);
  auVar75 = vfmadd231ps_fma(auVar224,auVar74,auVar12);
  auVar74 = vfmadd231ps_fma(auVar196,auVar64,auVar74);
  auVar107 = vfmadd231ps_fma(auVar203,auVar265,auVar9);
  auVar75 = vfmadd231ps_fma(auVar75,auVar265,auVar11);
  auVar121 = vfmadd231ps_fma(auVar74,auVar65,auVar265);
  auVar266._4_4_ = auVar125._0_4_;
  auVar266._0_4_ = auVar125._0_4_;
  auVar266._8_4_ = auVar125._0_4_;
  auVar266._12_4_ = auVar125._0_4_;
  auVar74 = vshufps_avx(auVar125,auVar125,0x55);
  auVar203 = vshufps_avx(auVar125,auVar125,0xaa);
  fVar61 = auVar203._0_4_;
  auVar136._0_4_ = fVar61 * auVar269._0_4_;
  fVar134 = auVar203._4_4_;
  auVar136._4_4_ = fVar134 * auVar269._4_4_;
  fVar150 = auVar203._8_4_;
  auVar136._8_4_ = fVar150 * auVar269._8_4_;
  fVar151 = auVar203._12_4_;
  auVar136._12_4_ = fVar151 * auVar269._12_4_;
  auVar73._0_4_ = auVar13._0_4_ * fVar61;
  auVar73._4_4_ = auVar13._4_4_ * fVar134;
  auVar73._8_4_ = auVar13._8_4_ * fVar150;
  auVar73._12_4_ = auVar13._12_4_ * fVar151;
  auVar203._0_4_ = auVar96._0_4_ * fVar61;
  auVar203._4_4_ = auVar96._4_4_ * fVar134;
  auVar203._8_4_ = auVar96._8_4_ * fVar150;
  auVar203._12_4_ = auVar96._12_4_ * fVar151;
  auVar10 = vfmadd231ps_fma(auVar136,auVar74,auVar10);
  auVar269 = vfmadd231ps_fma(auVar73,auVar74,auVar12);
  auVar12 = vfmadd231ps_fma(auVar203,auVar74,auVar64);
  auVar13 = vfmadd231ps_fma(auVar10,auVar266,auVar9);
  auVar64 = vfmadd231ps_fma(auVar269,auVar266,auVar11);
  auVar96 = vfmadd231ps_fma(auVar12,auVar266,auVar65);
  auVar274._8_4_ = 0x7fffffff;
  auVar274._0_8_ = 0x7fffffff7fffffff;
  auVar274._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar107,auVar274);
  auVar120._8_4_ = 0x219392ef;
  auVar120._0_8_ = 0x219392ef219392ef;
  auVar120._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar120,1);
  auVar10 = vblendvps_avx(auVar107,auVar120,auVar9);
  auVar9 = vandps_avx(auVar75,auVar274);
  auVar9 = vcmpps_avx(auVar9,auVar120,1);
  auVar269 = vblendvps_avx(auVar75,auVar120,auVar9);
  auVar9 = vandps_avx(auVar121,auVar274);
  auVar9 = vcmpps_avx(auVar9,auVar120,1);
  auVar9 = vblendvps_avx(auVar121,auVar120,auVar9);
  auVar11 = vrcpps_avx(auVar10);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = &DAT_3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar11,auVar183);
  auVar11 = vfmadd132ps_fma(auVar10,auVar11,auVar11);
  auVar10 = vrcpps_avx(auVar269);
  auVar269 = vfnmadd213ps_fma(auVar269,auVar10,auVar183);
  auVar12 = vfmadd132ps_fma(auVar269,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar183);
  auVar65 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar13);
  auVar121._0_4_ = auVar11._0_4_ * auVar9._0_4_;
  auVar121._4_4_ = auVar11._4_4_ * auVar9._4_4_;
  auVar121._8_4_ = auVar11._8_4_ * auVar9._8_4_;
  auVar121._12_4_ = auVar11._12_4_ * auVar9._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar13);
  auVar137._0_4_ = auVar11._0_4_ * auVar9._0_4_;
  auVar137._4_4_ = auVar11._4_4_ * auVar9._4_4_;
  auVar137._8_4_ = auVar11._8_4_ * auVar9._8_4_;
  auVar137._12_4_ = auVar11._12_4_ * auVar9._12_4_;
  auVar75._1_3_ = 0;
  auVar75[0] = PVar3;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar269);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar60 * -2 + 6);
  auVar9 = vpmovsxwd_avx(auVar11);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar64);
  auVar197._0_4_ = auVar9._0_4_ * auVar12._0_4_;
  auVar197._4_4_ = auVar9._4_4_ * auVar12._4_4_;
  auVar197._8_4_ = auVar9._8_4_ * auVar12._8_4_;
  auVar197._12_4_ = auVar9._12_4_ * auVar12._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar10);
  auVar9 = vsubps_avx(auVar9,auVar64);
  auVar74._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar74._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar74._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar74._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar54 + uVar60 + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar96);
  auVar107._0_4_ = auVar65._0_4_ * auVar9._0_4_;
  auVar107._4_4_ = auVar65._4_4_ * auVar9._4_4_;
  auVar107._8_4_ = auVar65._8_4_ * auVar9._8_4_;
  auVar107._12_4_ = auVar65._12_4_ * auVar9._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar13);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar96);
  auVar64._0_4_ = auVar65._0_4_ * auVar9._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar9._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar9._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar121,auVar137);
  auVar10 = vpminsd_avx(auVar197,auVar74);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vpminsd_avx(auVar107,auVar64);
  uVar62 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar214._4_4_ = uVar62;
  auVar214._0_4_ = uVar62;
  auVar214._8_4_ = uVar62;
  auVar214._12_4_ = uVar62;
  auVar10 = vmaxps_avx(auVar10,auVar214);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  local_4a0._0_4_ = auVar9._0_4_ * 0.99999964;
  local_4a0._4_4_ = auVar9._4_4_ * 0.99999964;
  local_4a0._8_4_ = auVar9._8_4_ * 0.99999964;
  local_4a0._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar121,auVar137);
  auVar10 = vpmaxsd_avx(auVar197,auVar74);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar10 = vpmaxsd_avx(auVar107,auVar64);
  uVar62 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar96._4_4_ = uVar62;
  auVar96._0_4_ = uVar62;
  auVar96._8_4_ = uVar62;
  auVar96._12_4_ = uVar62;
  auVar10 = vminps_avx(auVar10,auVar96);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar65._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar75[4] = PVar3;
  auVar75._5_3_ = 0;
  auVar75[8] = PVar3;
  auVar75._9_3_ = 0;
  auVar75[0xc] = PVar3;
  auVar75._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar75,_DAT_01ff0cf0);
  auVar9 = vcmpps_avx(local_4a0,auVar65,2);
  auVar9 = vandps_avx(auVar9,auVar10);
  uVar50 = vmovmskps_avx(auVar9);
  if (uVar50 == 0) {
    return;
  }
  uVar50 = uVar50 & 0xff;
  auVar70._16_16_ = mm_lookupmask_ps._240_16_;
  auVar70._0_16_ = mm_lookupmask_ps._240_16_;
  local_3a0 = vblendps_avx(auVar70,ZEXT832(0) << 0x20,0x80);
  iVar51 = 1 << ((uint)k & 0x1f);
  auVar71._4_4_ = iVar51;
  auVar71._0_4_ = iVar51;
  auVar71._8_4_ = iVar51;
  auVar71._12_4_ = iVar51;
  auVar71._16_4_ = iVar51;
  auVar71._20_4_ = iVar51;
  auVar71._24_4_ = iVar51;
  auVar71._28_4_ = iVar51;
  auVar15 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar70 = vpand_avx2(auVar71,auVar15);
  local_360 = vpcmpeqd_avx2(auVar70,auVar15);
LAB_01683d52:
  lVar56 = 0;
  uVar60 = (ulong)uVar50;
  for (uVar54 = uVar60; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar56 = lVar56 + 1;
  }
  uVar50 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar56 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar50].ptr;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar13 = *(undefined1 (*) [16])(_Var8 + uVar54 * (long)pvVar7);
  auVar9 = *(undefined1 (*) [16])(_Var8 + (uVar54 + 1) * (long)pvVar7);
  auVar10 = *(undefined1 (*) [16])(_Var8 + (uVar54 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar54 + 3));
  fVar61 = *pfVar1;
  fVar134 = pfVar1[1];
  fVar150 = pfVar1[2];
  fVar151 = pfVar1[3];
  lVar56 = *(long *)&pGVar5[1].time_range.upper;
  auVar269 = *(undefined1 (*) [16])(lVar56 + (long)p_Var6 * uVar54);
  auVar11 = *(undefined1 (*) [16])(lVar56 + (long)p_Var6 * (uVar54 + 1));
  auVar12 = *(undefined1 (*) [16])(lVar56 + (long)p_Var6 * (uVar54 + 2));
  uVar60 = uVar60 - 1 & uVar60;
  pfVar1 = (float *)(lVar56 + (long)p_Var6 * (uVar54 + 3));
  fVar152 = *pfVar1;
  fVar94 = pfVar1[1];
  fVar95 = pfVar1[2];
  fVar63 = pfVar1[3];
  if (uVar60 != 0) {
    uVar59 = uVar60 - 1 & uVar60;
    for (uVar54 = uVar60; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    }
    if (uVar59 != 0) {
      for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar76._0_4_ = fVar152 * 0.0;
  auVar76._4_4_ = fVar94 * 0.0;
  auVar76._8_4_ = fVar95 * 0.0;
  auVar76._12_4_ = fVar63 * 0.0;
  auVar267._8_4_ = 0x3e2aaaab;
  auVar267._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar267._12_4_ = 0x3e2aaaab;
  auVar64 = vfmadd213ps_fma(auVar267,auVar12,auVar76);
  auVar198._8_4_ = 0x3f2aaaab;
  auVar198._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar198._12_4_ = 0x3f2aaaab;
  auVar64 = vfmadd231ps_fma(auVar64,auVar11,auVar198);
  auVar96 = vfmadd231ps_fma(auVar64,auVar269,auVar267);
  auVar138._8_4_ = 0x3f000000;
  auVar138._0_8_ = 0x3f0000003f000000;
  auVar138._12_4_ = 0x3f000000;
  auVar64 = vfmadd231ps_fma(auVar76,auVar12,auVar138);
  auVar64 = vfnmadd231ps_fma(auVar64,auVar11,(undefined1  [16])0x0);
  auVar203 = vfnmadd231ps_fma(auVar64,auVar269,auVar138);
  auVar243._0_4_ = fVar61 * 0.0;
  auVar243._4_4_ = fVar134 * 0.0;
  auVar243._8_4_ = fVar150 * 0.0;
  auVar243._12_4_ = fVar151 * 0.0;
  auVar64 = vfmadd213ps_fma(auVar267,auVar10,auVar243);
  auVar64 = vfmadd231ps_fma(auVar64,auVar9,auVar198);
  auVar64 = vfmadd231ps_fma(auVar64,auVar13,auVar267);
  auVar74 = vfmadd231ps_fma(auVar243,auVar10,auVar138);
  auVar74 = vfnmadd231ps_fma(auVar74,auVar9,(undefined1  [16])0x0);
  auVar75 = vfnmadd231ps_fma(auVar74,auVar13,auVar138);
  auVar108._0_4_ = fVar152 * 0.16666667;
  auVar108._4_4_ = fVar94 * 0.16666667;
  auVar108._8_4_ = fVar95 * 0.16666667;
  auVar108._12_4_ = fVar63 * 0.16666667;
  auVar74 = vfmadd231ps_fma(auVar108,auVar12,auVar198);
  auVar74 = vfmadd231ps_fma(auVar74,auVar11,auVar267);
  auVar74 = vfmadd231ps_fma(auVar74,auVar269,(undefined1  [16])0x0);
  auVar122._0_4_ = fVar152 * 0.5;
  auVar122._4_4_ = fVar94 * 0.5;
  auVar122._8_4_ = fVar95 * 0.5;
  auVar122._12_4_ = fVar63 * 0.5;
  auVar12 = vfmadd231ps_fma(auVar122,(undefined1  [16])0x0,auVar12);
  auVar11 = vfnmadd231ps_fma(auVar12,auVar138,auVar11);
  auVar107 = vfnmadd231ps_fma(auVar11,(undefined1  [16])0x0,auVar269);
  auVar215._0_4_ = fVar61 * 0.16666667;
  auVar215._4_4_ = fVar134 * 0.16666667;
  auVar215._8_4_ = fVar150 * 0.16666667;
  auVar215._12_4_ = fVar151 * 0.16666667;
  auVar66._8_4_ = 0x3f2aaaab;
  auVar66._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar66._12_4_ = 0x3f2aaaab;
  auVar269 = vfmadd231ps_fma(auVar215,auVar10,auVar66);
  auVar269 = vfmadd231ps_fma(auVar269,auVar9,auVar267);
  auVar12 = vfmadd231ps_fma(auVar269,auVar13,(undefined1  [16])0x0);
  auVar225._0_4_ = fVar61 * 0.5;
  auVar225._4_4_ = fVar134 * 0.5;
  auVar225._8_4_ = fVar150 * 0.5;
  auVar225._12_4_ = fVar151 * 0.5;
  auVar10 = vfmadd231ps_fma(auVar225,(undefined1  [16])0x0,auVar10);
  auVar9 = vfnmadd231ps_fma(auVar10,auVar138,auVar9);
  auVar13 = vfnmadd231ps_fma(auVar9,(undefined1  [16])0x0,auVar13);
  auVar9 = vshufps_avx(auVar203,auVar203,0xc9);
  auVar10 = vshufps_avx(auVar64,auVar64,0xc9);
  fVar152 = auVar203._0_4_;
  auVar158._0_4_ = fVar152 * auVar10._0_4_;
  fVar94 = auVar203._4_4_;
  auVar158._4_4_ = fVar94 * auVar10._4_4_;
  fVar95 = auVar203._8_4_;
  auVar158._8_4_ = fVar95 * auVar10._8_4_;
  fVar63 = auVar203._12_4_;
  auVar158._12_4_ = fVar63 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar158,auVar9,auVar64);
  auVar269 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar159._0_4_ = fVar152 * auVar10._0_4_;
  auVar159._4_4_ = fVar94 * auVar10._4_4_;
  auVar159._8_4_ = fVar95 * auVar10._8_4_;
  auVar159._12_4_ = fVar63 * auVar10._12_4_;
  auVar9 = vfmsub231ps_fma(auVar159,auVar9,auVar75);
  auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar107,auVar107,0xc9);
  auVar10 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar177 = auVar107._0_4_;
  auVar139._0_4_ = fVar177 * auVar10._0_4_;
  fVar153 = auVar107._4_4_;
  auVar139._4_4_ = fVar153 * auVar10._4_4_;
  fVar154 = auVar107._8_4_;
  auVar139._8_4_ = fVar154 * auVar10._8_4_;
  fVar155 = auVar107._12_4_;
  auVar139._12_4_ = fVar155 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar139,auVar9,auVar12);
  auVar12 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar184._0_4_ = fVar177 * auVar10._0_4_;
  auVar184._4_4_ = fVar153 * auVar10._4_4_;
  auVar184._8_4_ = fVar154 * auVar10._8_4_;
  auVar184._12_4_ = fVar155 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar184,auVar9,auVar13);
  auVar9 = vdpps_avx(auVar269,auVar269,0x7f);
  auVar13 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar134 = auVar9._0_4_;
  auVar64 = ZEXT416((uint)fVar134);
  auVar10 = vrsqrtss_avx(auVar64,auVar64);
  fVar61 = auVar10._0_4_;
  auVar10 = vdpps_avx(auVar269,auVar11,0x7f);
  fVar61 = fVar61 * 1.5 + fVar134 * -0.5 * fVar61 * fVar61 * fVar61;
  fVar156 = auVar269._0_4_ * fVar61;
  fVar176 = auVar269._4_4_ * fVar61;
  fVar178 = auVar269._8_4_ * fVar61;
  fVar179 = auVar269._12_4_ * fVar61;
  auVar235._0_4_ = auVar11._0_4_ * fVar134;
  auVar235._4_4_ = auVar11._4_4_ * fVar134;
  auVar235._8_4_ = auVar11._8_4_ * fVar134;
  auVar235._12_4_ = auVar11._12_4_ * fVar134;
  fVar134 = auVar10._0_4_;
  auVar199._0_4_ = auVar269._0_4_ * fVar134;
  auVar199._4_4_ = auVar269._4_4_ * fVar134;
  auVar199._8_4_ = auVar269._8_4_ * fVar134;
  auVar199._12_4_ = auVar269._12_4_ * fVar134;
  auVar11 = vsubps_avx(auVar235,auVar199);
  auVar10 = vrcpss_avx(auVar64,auVar64);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar150 = auVar10._0_4_ * auVar9._0_4_;
  auVar10 = vdpps_avx(auVar12,auVar12,0x7f);
  auVar9 = vblendps_avx(auVar10,_DAT_01feba10,0xe);
  auVar269 = vrsqrtss_avx(auVar9,auVar9);
  fVar134 = auVar269._0_4_;
  fVar151 = auVar10._0_4_;
  fVar134 = fVar134 * 1.5 + fVar151 * -0.5 * fVar134 * fVar134 * fVar134;
  fVar242 = fVar134 * auVar12._0_4_;
  fVar254 = fVar134 * auVar12._4_4_;
  fVar255 = fVar134 * auVar12._8_4_;
  fVar256 = fVar134 * auVar12._12_4_;
  auVar269 = vdpps_avx(auVar12,auVar13,0x7f);
  auVar185._0_4_ = fVar151 * auVar13._0_4_;
  auVar185._4_4_ = fVar151 * auVar13._4_4_;
  auVar185._8_4_ = fVar151 * auVar13._8_4_;
  auVar185._12_4_ = fVar151 * auVar13._12_4_;
  fVar151 = auVar269._0_4_;
  auVar140._0_4_ = fVar151 * auVar12._0_4_;
  auVar140._4_4_ = fVar151 * auVar12._4_4_;
  auVar140._8_4_ = fVar151 * auVar12._8_4_;
  auVar140._12_4_ = fVar151 * auVar12._12_4_;
  auVar269 = vsubps_avx(auVar185,auVar140);
  auVar9 = vrcpss_avx(auVar9,auVar9);
  auVar10 = vfnmadd213ss_fma(auVar10,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar151 = auVar10._0_4_ * auVar9._0_4_;
  auVar9 = vshufps_avx(auVar96,auVar96,0xff);
  auVar216._0_4_ = auVar9._0_4_ * fVar156;
  auVar216._4_4_ = auVar9._4_4_ * fVar176;
  auVar216._8_4_ = auVar9._8_4_ * fVar178;
  auVar216._12_4_ = auVar9._12_4_ * fVar179;
  local_5b0 = vsubps_avx(auVar96,auVar216);
  auVar10 = vshufps_avx(auVar203,auVar203,0xff);
  auVar160._0_4_ = auVar10._0_4_ * fVar156 + fVar61 * auVar11._0_4_ * fVar150 * auVar9._0_4_;
  auVar160._4_4_ = auVar10._4_4_ * fVar176 + fVar61 * auVar11._4_4_ * fVar150 * auVar9._4_4_;
  auVar160._8_4_ = auVar10._8_4_ * fVar178 + fVar61 * auVar11._8_4_ * fVar150 * auVar9._8_4_;
  auVar160._12_4_ = auVar10._12_4_ * fVar179 + fVar61 * auVar11._12_4_ * fVar150 * auVar9._12_4_;
  auVar11 = vsubps_avx(auVar203,auVar160);
  local_5c0._0_4_ = auVar216._0_4_ + auVar96._0_4_;
  local_5c0._4_4_ = auVar216._4_4_ + auVar96._4_4_;
  fStack_5b8 = auVar216._8_4_ + auVar96._8_4_;
  fStack_5b4 = auVar216._12_4_ + auVar96._12_4_;
  auVar9 = vshufps_avx(auVar74,auVar74,0xff);
  auVar97._0_4_ = fVar242 * auVar9._0_4_;
  auVar97._4_4_ = fVar254 * auVar9._4_4_;
  auVar97._8_4_ = fVar255 * auVar9._8_4_;
  auVar97._12_4_ = fVar256 * auVar9._12_4_;
  local_5d0 = vsubps_avx(auVar74,auVar97);
  auVar10 = vshufps_avx(auVar107,auVar107,0xff);
  auVar77._0_4_ = fVar242 * auVar10._0_4_ + auVar9._0_4_ * fVar134 * auVar269._0_4_ * fVar151;
  auVar77._4_4_ = fVar254 * auVar10._4_4_ + auVar9._4_4_ * fVar134 * auVar269._4_4_ * fVar151;
  auVar77._8_4_ = fVar255 * auVar10._8_4_ + auVar9._8_4_ * fVar134 * auVar269._8_4_ * fVar151;
  auVar77._12_4_ = fVar256 * auVar10._12_4_ + auVar9._12_4_ * fVar134 * auVar269._12_4_ * fVar151;
  auVar9 = vsubps_avx(auVar107,auVar77);
  local_5e0._0_4_ = auVar74._0_4_ + auVar97._0_4_;
  local_5e0._4_4_ = auVar74._4_4_ + auVar97._4_4_;
  fStack_5d8 = auVar74._8_4_ + auVar97._8_4_;
  fStack_5d4 = auVar74._12_4_ + auVar97._12_4_;
  local_5f0._0_4_ = local_5b0._0_4_ + auVar11._0_4_ * 0.33333334;
  local_5f0._4_4_ = local_5b0._4_4_ + auVar11._4_4_ * 0.33333334;
  local_5f0._8_4_ = local_5b0._8_4_ + auVar11._8_4_ * 0.33333334;
  local_5f0._12_4_ = local_5b0._12_4_ + auVar11._12_4_ * 0.33333334;
  auVar78._0_4_ = auVar9._0_4_ * 0.33333334;
  auVar78._4_4_ = auVar9._4_4_ * 0.33333334;
  auVar78._8_4_ = auVar9._8_4_ * 0.33333334;
  auVar78._12_4_ = auVar9._12_4_ * 0.33333334;
  local_600 = vsubps_avx(local_5d0,auVar78);
  local_590 = vsubps_avx(local_5b0,auVar65);
  auVar9 = vshufps_avx(local_590,local_590,0x55);
  auVar10 = vshufps_avx(local_590,local_590,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar61 = pre->ray_space[k].vz.field_0.m128[0];
  fVar134 = pre->ray_space[k].vz.field_0.m128[1];
  fVar150 = pre->ray_space[k].vz.field_0.m128[2];
  fVar151 = pre->ray_space[k].vz.field_0.m128[3];
  auVar79._0_4_ = fVar61 * auVar10._0_4_;
  auVar79._4_4_ = fVar134 * auVar10._4_4_;
  auVar79._8_4_ = fVar150 * auVar10._8_4_;
  auVar79._12_4_ = fVar151 * auVar10._12_4_;
  auVar269 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar2,auVar9);
  local_5a0 = vsubps_avx(local_5f0,auVar65);
  auVar9 = vshufps_avx(local_5a0,local_5a0,0x55);
  auVar10 = vshufps_avx(local_5a0,local_5a0,0xaa);
  auVar80._0_4_ = fVar61 * auVar10._0_4_;
  auVar80._4_4_ = fVar134 * auVar10._4_4_;
  auVar80._8_4_ = fVar150 * auVar10._8_4_;
  auVar80._12_4_ = fVar151 * auVar10._12_4_;
  auVar10 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar2,auVar9);
  local_3f0 = vsubps_avx(local_600,auVar65);
  auVar9 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar244._0_4_ = fVar61 * auVar9._0_4_;
  auVar244._4_4_ = fVar134 * auVar9._4_4_;
  auVar244._8_4_ = fVar150 * auVar9._8_4_;
  auVar244._12_4_ = fVar151 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar11 = vfmadd231ps_fma(auVar244,(undefined1  [16])aVar2,auVar9);
  local_400 = vsubps_avx(local_5d0,auVar65);
  auVar9 = vshufps_avx(local_400,local_400,0xaa);
  auVar81._0_4_ = fVar61 * auVar9._0_4_;
  auVar81._4_4_ = fVar134 * auVar9._4_4_;
  auVar81._8_4_ = fVar150 * auVar9._8_4_;
  auVar81._12_4_ = fVar151 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_400,local_400,0x55);
  auVar12 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar2,auVar9);
  local_410 = vsubps_avx(_local_5c0,auVar65);
  auVar9 = vshufps_avx(local_410,local_410,0xaa);
  auVar141._0_4_ = fVar61 * auVar9._0_4_;
  auVar141._4_4_ = fVar134 * auVar9._4_4_;
  auVar141._8_4_ = fVar150 * auVar9._8_4_;
  auVar141._12_4_ = fVar151 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_410,local_410,0x55);
  auVar13 = vfmadd231ps_fma(auVar141,(undefined1  [16])aVar2,auVar9);
  local_610._0_4_ = (fVar152 + auVar160._0_4_) * 0.33333334 + (float)local_5c0._0_4_;
  local_610._4_4_ = (fVar94 + auVar160._4_4_) * 0.33333334 + (float)local_5c0._4_4_;
  fStack_608 = (fVar95 + auVar160._8_4_) * 0.33333334 + fStack_5b8;
  fStack_604 = (fVar63 + auVar160._12_4_) * 0.33333334 + fStack_5b4;
  local_420 = vsubps_avx(_local_610,auVar65);
  auVar9 = vshufps_avx(local_420,local_420,0xaa);
  auVar200._0_4_ = auVar9._0_4_ * fVar61;
  auVar200._4_4_ = auVar9._4_4_ * fVar134;
  auVar200._8_4_ = auVar9._8_4_ * fVar150;
  auVar200._12_4_ = auVar9._12_4_ * fVar151;
  auVar9 = vshufps_avx(local_420,local_420,0x55);
  auVar64 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar2,auVar9);
  auVar217._0_4_ = (fVar177 + auVar77._0_4_) * 0.33333334;
  auVar217._4_4_ = (fVar153 + auVar77._4_4_) * 0.33333334;
  auVar217._8_4_ = (fVar154 + auVar77._8_4_) * 0.33333334;
  auVar217._12_4_ = (fVar155 + auVar77._12_4_) * 0.33333334;
  _local_620 = vsubps_avx(_local_5e0,auVar217);
  local_430 = vsubps_avx(_local_620,auVar65);
  auVar9 = vshufps_avx(local_430,local_430,0xaa);
  auVar218._0_4_ = auVar9._0_4_ * fVar61;
  auVar218._4_4_ = auVar9._4_4_ * fVar134;
  auVar218._8_4_ = auVar9._8_4_ * fVar150;
  auVar218._12_4_ = auVar9._12_4_ * fVar151;
  auVar9 = vshufps_avx(local_430,local_430,0x55);
  auVar96 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar2,auVar9);
  local_440 = vsubps_avx(_local_5e0,auVar65);
  auVar9 = vshufps_avx(local_440,local_440,0xaa);
  auVar82._0_4_ = fVar61 * auVar9._0_4_;
  auVar82._4_4_ = fVar134 * auVar9._4_4_;
  auVar82._8_4_ = fVar150 * auVar9._8_4_;
  auVar82._12_4_ = fVar151 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_440,local_440,0x55);
  auVar9 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar2,auVar9);
  auVar161._4_4_ = local_590._0_4_;
  auVar161._0_4_ = local_590._0_4_;
  auVar161._8_4_ = local_590._0_4_;
  auVar161._12_4_ = local_590._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar65 = vfmadd231ps_fma(auVar269,(undefined1  [16])aVar2,auVar161);
  auVar162._4_4_ = local_5a0._0_4_;
  auVar162._0_4_ = local_5a0._0_4_;
  auVar162._8_4_ = local_5a0._0_4_;
  auVar162._12_4_ = local_5a0._0_4_;
  auVar74 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar162);
  uVar62 = local_3f0._0_4_;
  auVar163._4_4_ = uVar62;
  auVar163._0_4_ = uVar62;
  auVar163._8_4_ = uVar62;
  auVar163._12_4_ = uVar62;
  auVar203 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar163);
  uVar62 = local_400._0_4_;
  auVar164._4_4_ = uVar62;
  auVar164._0_4_ = uVar62;
  auVar164._8_4_ = uVar62;
  auVar164._12_4_ = uVar62;
  auVar75 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar164);
  uVar62 = local_410._0_4_;
  auVar165._4_4_ = uVar62;
  auVar165._0_4_ = uVar62;
  auVar165._8_4_ = uVar62;
  auVar165._12_4_ = uVar62;
  auVar107 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar165);
  uVar62 = local_420._0_4_;
  auVar166._4_4_ = uVar62;
  auVar166._0_4_ = uVar62;
  auVar166._8_4_ = uVar62;
  auVar166._12_4_ = uVar62;
  auVar64 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar2,auVar166);
  uVar62 = local_430._0_4_;
  auVar167._4_4_ = uVar62;
  auVar167._0_4_ = uVar62;
  auVar167._8_4_ = uVar62;
  auVar167._12_4_ = uVar62;
  auVar96 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar2,auVar167);
  uVar62 = local_440._0_4_;
  auVar168._4_4_ = uVar62;
  auVar168._0_4_ = uVar62;
  auVar168._8_4_ = uVar62;
  auVar168._12_4_ = uVar62;
  auVar121 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar168);
  auVar11 = vmovlhps_avx(auVar65,auVar107);
  auVar12 = vmovlhps_avx(auVar74,auVar64);
  auVar13 = vmovlhps_avx(auVar203,auVar96);
  _local_580 = vmovlhps_avx(auVar75,auVar121);
  auVar9 = vminps_avx(auVar11,auVar12);
  auVar10 = vminps_avx(auVar13,_local_580);
  auVar269 = vminps_avx(auVar9,auVar10);
  auVar9 = vmaxps_avx(auVar11,auVar12);
  auVar10 = vmaxps_avx(auVar13,_local_580);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vshufpd_avx(auVar269,auVar269,3);
  auVar269 = vminps_avx(auVar269,auVar10);
  auVar10 = vshufpd_avx(auVar9,auVar9,3);
  auVar10 = vmaxps_avx(auVar9,auVar10);
  auVar9 = vandps_avx(auVar274,auVar269);
  auVar10 = vandps_avx(auVar274,auVar10);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vmovshdup_avx(auVar9);
  auVar9 = vmaxss_avx(auVar10,auVar9);
  local_2e0 = auVar9._0_4_ * 9.536743e-07;
  local_500._8_8_ = auVar65._0_8_;
  local_500._0_8_ = auVar65._0_8_;
  local_510._8_8_ = auVar74._0_8_;
  local_510._0_8_ = auVar74._0_8_;
  local_520._0_8_ = auVar203._0_8_;
  local_520._8_8_ = local_520._0_8_;
  local_780._0_8_ = auVar75._0_8_;
  local_530._8_8_ = local_780._0_8_;
  local_530._0_8_ = local_780._0_8_;
  local_540 = auVar107._0_8_;
  register0x00001348 = local_540;
  register0x000013c8 = auVar64._0_8_;
  local_550 = auVar64._0_8_;
  register0x00001408 = auVar96._0_8_;
  local_560 = auVar96._0_8_;
  register0x00001448 = auVar121._0_8_;
  local_570 = auVar121._0_8_;
  local_3e0 = ZEXT416((uint)local_2e0);
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_300 = -local_2e0;
  fStack_2fc = local_300;
  fStack_2f8 = local_300;
  fStack_2f4 = local_300;
  fStack_2f0 = local_300;
  fStack_2ec = local_300;
  fStack_2e8 = local_300;
  fStack_2e4 = local_300;
  local_320 = uVar50;
  uStack_31c = uVar50;
  uStack_318 = uVar50;
  uStack_314 = uVar50;
  uStack_310 = uVar50;
  uStack_30c = uVar50;
  uStack_308 = uVar50;
  uStack_304 = uVar50;
  local_340 = uVar4;
  uStack_33c = uVar4;
  uStack_338 = uVar4;
  uStack_334 = uVar4;
  uStack_330 = uVar4;
  uStack_32c = uVar4;
  uStack_328 = uVar4;
  uStack_324 = uVar4;
  uVar54 = 0;
  fVar61 = *(float *)(ray + k * 4 + 0x60);
  local_3b0 = vsubps_avx(auVar12,auVar11);
  local_3c0 = vsubps_avx(auVar13,auVar12);
  local_3d0 = vsubps_avx(_local_580,auVar13);
  local_460 = vsubps_avx(_local_5c0,local_5b0);
  local_470 = vsubps_avx(_local_610,local_5f0);
  local_480 = vsubps_avx(_local_620,local_600);
  _local_490 = vsubps_avx(_local_5e0,local_5d0);
  local_780 = ZEXT816(0x3f80000000000000);
  local_450 = local_780;
  do {
    auVar9 = vshufps_avx(local_780,local_780,0x50);
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = &DAT_3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar117._16_4_ = 0x3f800000;
    auVar117._0_16_ = auVar109;
    auVar117._20_4_ = 0x3f800000;
    auVar117._24_4_ = 0x3f800000;
    auVar117._28_4_ = 0x3f800000;
    auVar10 = vsubps_avx(auVar109,auVar9);
    fVar134 = auVar9._0_4_;
    auVar67._0_4_ = local_540._0_4_ * fVar134;
    fVar150 = auVar9._4_4_;
    auVar67._4_4_ = local_540._4_4_ * fVar150;
    fVar151 = auVar9._8_4_;
    auVar67._8_4_ = local_540._8_4_ * fVar151;
    fVar152 = auVar9._12_4_;
    auVar67._12_4_ = local_540._12_4_ * fVar152;
    auVar142._0_4_ = local_550._0_4_ * fVar134;
    auVar142._4_4_ = local_550._4_4_ * fVar150;
    auVar142._8_4_ = local_550._8_4_ * fVar151;
    auVar142._12_4_ = local_550._12_4_ * fVar152;
    auVar186._0_4_ = local_560._0_4_ * fVar134;
    auVar186._4_4_ = local_560._4_4_ * fVar150;
    auVar186._8_4_ = local_560._8_4_ * fVar151;
    auVar186._12_4_ = local_560._12_4_ * fVar152;
    auVar268._0_4_ = local_570._0_4_ * fVar134;
    auVar268._4_4_ = local_570._4_4_ * fVar150;
    auVar268._8_4_ = local_570._8_4_ * fVar151;
    auVar268._12_4_ = local_570._12_4_ * fVar152;
    auVar64 = vfmadd231ps_fma(auVar67,auVar10,local_500);
    auVar96 = vfmadd231ps_fma(auVar142,auVar10,local_510);
    auVar74 = vfmadd231ps_fma(auVar186,auVar10,local_520);
    auVar203 = vfmadd231ps_fma(auVar268,local_530,auVar10);
    local_720 = auVar203._0_4_;
    auVar9 = vmovshdup_avx(local_450);
    fVar134 = local_450._0_4_;
    fVar94 = (auVar9._0_4_ - fVar134) * 0.04761905;
    auVar213._4_4_ = fVar134;
    auVar213._0_4_ = fVar134;
    auVar213._8_4_ = fVar134;
    auVar213._12_4_ = fVar134;
    auVar213._16_4_ = fVar134;
    auVar213._20_4_ = fVar134;
    auVar213._24_4_ = fVar134;
    auVar213._28_4_ = fVar134;
    auVar104._0_8_ = auVar9._0_8_;
    auVar104._8_8_ = auVar104._0_8_;
    auVar104._16_8_ = auVar104._0_8_;
    auVar104._24_8_ = auVar104._0_8_;
    auVar70 = vsubps_avx(auVar104,auVar213);
    uVar62 = auVar64._0_4_;
    auVar278._4_4_ = uVar62;
    auVar278._0_4_ = uVar62;
    auVar278._8_4_ = uVar62;
    auVar278._12_4_ = uVar62;
    auVar278._16_4_ = uVar62;
    auVar278._20_4_ = uVar62;
    auVar278._24_4_ = uVar62;
    auVar278._28_4_ = uVar62;
    auVar9 = vmovshdup_avx(auVar64);
    uVar157 = auVar9._0_8_;
    auVar263._8_8_ = uVar157;
    auVar263._0_8_ = uVar157;
    auVar263._16_8_ = uVar157;
    auVar263._24_8_ = uVar157;
    fVar95 = auVar96._0_4_;
    auVar90._4_4_ = fVar95;
    auVar90._0_4_ = fVar95;
    auVar90._8_4_ = fVar95;
    auVar90._12_4_ = fVar95;
    auVar90._16_4_ = fVar95;
    auVar90._20_4_ = fVar95;
    auVar90._24_4_ = fVar95;
    auVar90._28_4_ = fVar95;
    auVar10 = vmovshdup_avx(auVar96);
    auVar173._0_8_ = auVar10._0_8_;
    auVar173._8_8_ = auVar173._0_8_;
    auVar173._16_8_ = auVar173._0_8_;
    auVar173._24_8_ = auVar173._0_8_;
    fVar153 = auVar74._0_4_;
    auVar241._4_4_ = fVar153;
    auVar241._0_4_ = fVar153;
    auVar241._8_4_ = fVar153;
    auVar241._12_4_ = fVar153;
    auVar241._16_4_ = fVar153;
    auVar241._20_4_ = fVar153;
    auVar241._24_4_ = fVar153;
    auVar241._28_4_ = fVar153;
    auVar269 = vmovshdup_avx(auVar74);
    auVar223._0_8_ = auVar269._0_8_;
    auVar223._8_8_ = auVar223._0_8_;
    auVar223._16_8_ = auVar223._0_8_;
    auVar223._24_8_ = auVar223._0_8_;
    auVar65 = vmovshdup_avx(auVar203);
    auVar75 = vfmadd132ps_fma(auVar70,auVar213,_DAT_02020f20);
    auVar70 = vsubps_avx(auVar117,ZEXT1632(auVar75));
    fVar134 = auVar75._0_4_;
    auVar271._0_4_ = fVar95 * fVar134;
    fVar150 = auVar75._4_4_;
    auVar271._4_4_ = fVar95 * fVar150;
    fVar151 = auVar75._8_4_;
    auVar271._8_4_ = fVar95 * fVar151;
    fVar152 = auVar75._12_4_;
    auVar271._12_4_ = fVar95 * fVar152;
    auVar271._16_4_ = fVar95 * 0.0;
    auVar271._20_4_ = fVar95 * 0.0;
    auVar271._24_4_ = fVar95 * 0.0;
    auVar271._28_4_ = 0;
    auVar75 = vfmadd231ps_fma(auVar271,auVar70,auVar278);
    fVar63 = auVar10._0_4_;
    auVar251._0_4_ = fVar63 * fVar134;
    fVar177 = auVar10._4_4_;
    auVar251._4_4_ = fVar177 * fVar150;
    auVar251._8_4_ = fVar63 * fVar151;
    auVar251._12_4_ = fVar177 * fVar152;
    auVar251._16_4_ = fVar63 * 0.0;
    auVar251._20_4_ = fVar177 * 0.0;
    auVar251._24_4_ = fVar63 * 0.0;
    auVar251._28_4_ = 0;
    auVar107 = vfmadd231ps_fma(auVar251,auVar70,auVar263);
    auVar15._4_4_ = fVar153 * fVar150;
    auVar15._0_4_ = fVar153 * fVar134;
    auVar15._8_4_ = fVar153 * fVar151;
    auVar15._12_4_ = fVar153 * fVar152;
    auVar15._16_4_ = fVar153 * 0.0;
    auVar15._20_4_ = fVar153 * 0.0;
    auVar15._24_4_ = fVar153 * 0.0;
    auVar15._28_4_ = auVar9._4_4_;
    auVar121 = vfmadd231ps_fma(auVar15,auVar70,auVar90);
    fVar63 = auVar269._0_4_;
    fVar177 = auVar269._4_4_;
    auVar72._4_4_ = fVar177 * fVar150;
    auVar72._0_4_ = fVar63 * fVar134;
    auVar72._8_4_ = fVar63 * fVar151;
    auVar72._12_4_ = fVar177 * fVar152;
    auVar72._16_4_ = fVar63 * 0.0;
    auVar72._20_4_ = fVar177 * 0.0;
    auVar72._24_4_ = fVar63 * 0.0;
    auVar72._28_4_ = uVar62;
    auVar125 = vfmadd231ps_fma(auVar72,auVar70,auVar173);
    auVar9 = vshufps_avx(auVar64,auVar64,0xaa);
    auVar174._0_8_ = auVar9._0_8_;
    auVar174._8_8_ = auVar174._0_8_;
    auVar174._16_8_ = auVar174._0_8_;
    auVar174._24_8_ = auVar174._0_8_;
    auVar10 = vshufps_avx(auVar64,auVar64,0xff);
    uStack_6d8 = auVar10._0_8_;
    local_6e0 = (undefined1  [8])uStack_6d8;
    uStack_6d0 = uStack_6d8;
    uStack_6c8 = uStack_6d8;
    auVar14._4_4_ = fVar150 * local_720;
    auVar14._0_4_ = fVar134 * local_720;
    auVar14._8_4_ = fVar151 * local_720;
    auVar14._12_4_ = fVar152 * local_720;
    auVar14._16_4_ = local_720 * 0.0;
    auVar14._20_4_ = local_720 * 0.0;
    auVar14._24_4_ = local_720 * 0.0;
    auVar14._28_4_ = 0x3f800000;
    auVar73 = vfmadd231ps_fma(auVar14,auVar70,auVar241);
    auVar269 = vshufps_avx(auVar96,auVar96,0xaa);
    auVar132._0_8_ = auVar269._0_8_;
    auVar132._8_8_ = auVar132._0_8_;
    auVar132._16_8_ = auVar132._0_8_;
    auVar132._24_8_ = auVar132._0_8_;
    auVar64 = vshufps_avx(auVar96,auVar96,0xff);
    auVar149._0_8_ = auVar64._0_8_;
    auVar149._8_8_ = auVar149._0_8_;
    auVar149._16_8_ = auVar149._0_8_;
    auVar149._24_8_ = auVar149._0_8_;
    fVar63 = auVar65._0_4_;
    fVar177 = auVar65._4_4_;
    auVar16._4_4_ = fVar177 * fVar150;
    auVar16._0_4_ = fVar63 * fVar134;
    auVar16._8_4_ = fVar63 * fVar151;
    auVar16._12_4_ = fVar177 * fVar152;
    auVar16._16_4_ = fVar63 * 0.0;
    auVar16._20_4_ = fVar177 * 0.0;
    auVar16._24_4_ = fVar63 * 0.0;
    auVar16._28_4_ = fVar153;
    auVar120 = vfmadd231ps_fma(auVar16,auVar70,auVar223);
    auVar17._28_4_ = fVar95;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar121._12_4_ * fVar152,
                            CONCAT48(auVar121._8_4_ * fVar151,
                                     CONCAT44(auVar121._4_4_ * fVar150,auVar121._0_4_ * fVar134))));
    auVar75 = vfmadd231ps_fma(auVar17,auVar70,ZEXT1632(auVar75));
    auVar18._28_4_ = auVar10._4_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar125._12_4_ * fVar152,
                            CONCAT48(auVar125._8_4_ * fVar151,
                                     CONCAT44(auVar125._4_4_ * fVar150,auVar125._0_4_ * fVar134))));
    auVar107 = vfmadd231ps_fma(auVar18,auVar70,ZEXT1632(auVar107));
    auVar10 = vshufps_avx(auVar74,auVar74,0xaa);
    uVar157 = auVar10._0_8_;
    auVar252._8_8_ = uVar157;
    auVar252._0_8_ = uVar157;
    auVar252._16_8_ = uVar157;
    auVar252._24_8_ = uVar157;
    auVar65 = vshufps_avx(auVar74,auVar74,0xff);
    uVar157 = auVar65._0_8_;
    auVar272._8_8_ = uVar157;
    auVar272._0_8_ = uVar157;
    auVar272._16_8_ = uVar157;
    auVar272._24_8_ = uVar157;
    auVar121 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar152 * auVar73._12_4_,
                                                  CONCAT48(fVar151 * auVar73._8_4_,
                                                           CONCAT44(fVar150 * auVar73._4_4_,
                                                                    fVar134 * auVar73._0_4_)))),
                               auVar70,ZEXT1632(auVar121));
    auVar96 = vshufps_avx(auVar203,auVar203,0xaa);
    auVar74 = vshufps_avx(auVar203,auVar203,0xff);
    local_720 = auVar74._0_4_;
    fStack_71c = auVar74._4_4_;
    auVar253._28_4_ = fStack_71c;
    auVar253._0_28_ =
         ZEXT1628(CONCAT412(auVar120._12_4_ * fVar152,
                            CONCAT48(auVar120._8_4_ * fVar151,
                                     CONCAT44(auVar120._4_4_ * fVar150,auVar120._0_4_ * fVar134))));
    auVar74 = vfmadd231ps_fma(auVar253,auVar70,ZEXT1632(auVar125));
    auVar203 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar152 * auVar121._12_4_,
                                                  CONCAT48(fVar151 * auVar121._8_4_,
                                                           CONCAT44(fVar150 * auVar121._4_4_,
                                                                    fVar134 * auVar121._0_4_)))),
                               auVar70,ZEXT1632(auVar75));
    auVar15 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar75));
    auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar152 * auVar74._12_4_,
                                                 CONCAT48(fVar151 * auVar74._8_4_,
                                                          CONCAT44(fVar150 * auVar74._4_4_,
                                                                   fVar134 * auVar74._0_4_)))),
                              auVar70,ZEXT1632(auVar107));
    auVar71 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar107));
    fVar156 = fVar94 * auVar15._0_4_ * 3.0;
    fVar178 = fVar94 * auVar15._4_4_ * 3.0;
    auVar19._4_4_ = fVar178;
    auVar19._0_4_ = fVar156;
    fVar242 = fVar94 * auVar15._8_4_ * 3.0;
    auVar19._8_4_ = fVar242;
    fVar255 = fVar94 * auVar15._12_4_ * 3.0;
    auVar19._12_4_ = fVar255;
    fVar231 = fVar94 * auVar15._16_4_ * 3.0;
    auVar19._16_4_ = fVar231;
    fVar232 = fVar94 * auVar15._20_4_ * 3.0;
    auVar19._20_4_ = fVar232;
    fVar233 = fVar94 * auVar15._24_4_ * 3.0;
    auVar19._24_4_ = fVar233;
    auVar19._28_4_ = 0x40400000;
    local_700._0_4_ = fVar94 * auVar71._0_4_ * 3.0;
    local_700._4_4_ = fVar94 * auVar71._4_4_ * 3.0;
    fStack_6f8 = fVar94 * auVar71._8_4_ * 3.0;
    fStack_6f4 = fVar94 * auVar71._12_4_ * 3.0;
    fStack_6f0 = fVar94 * auVar71._16_4_ * 3.0;
    fStack_6ec = fVar94 * auVar71._20_4_ * 3.0;
    fStack_6e8 = fVar94 * auVar71._24_4_ * 3.0;
    fStack_6e4 = auVar71._28_4_;
    fVar95 = auVar269._0_4_;
    fVar63 = auVar269._4_4_;
    auVar20._4_4_ = fVar63 * fVar150;
    auVar20._0_4_ = fVar95 * fVar134;
    auVar20._8_4_ = fVar95 * fVar151;
    auVar20._12_4_ = fVar63 * fVar152;
    auVar20._16_4_ = fVar95 * 0.0;
    auVar20._20_4_ = fVar63 * 0.0;
    auVar20._24_4_ = fVar95 * 0.0;
    auVar20._28_4_ = auVar15._28_4_;
    auVar269 = vfmadd231ps_fma(auVar20,auVar70,auVar174);
    fVar95 = auVar64._0_4_;
    fVar177 = auVar64._4_4_;
    auVar21._4_4_ = fVar177 * fVar150;
    auVar21._0_4_ = fVar95 * fVar134;
    auVar21._8_4_ = fVar95 * fVar151;
    auVar21._12_4_ = fVar177 * fVar152;
    auVar21._16_4_ = fVar95 * 0.0;
    auVar21._20_4_ = fVar177 * 0.0;
    auVar21._24_4_ = fVar95 * 0.0;
    auVar21._28_4_ = auVar9._4_4_;
    auVar9 = vfmadd231ps_fma(auVar21,auVar70,_local_6e0);
    fVar95 = auVar10._0_4_;
    fVar177 = auVar10._4_4_;
    auVar22._4_4_ = fVar177 * fVar150;
    auVar22._0_4_ = fVar95 * fVar134;
    auVar22._8_4_ = fVar95 * fVar151;
    auVar22._12_4_ = fVar177 * fVar152;
    auVar22._16_4_ = fVar95 * 0.0;
    auVar22._20_4_ = fVar177 * 0.0;
    auVar22._24_4_ = fVar95 * 0.0;
    auVar22._28_4_ = fVar94;
    auVar10 = vfmadd231ps_fma(auVar22,auVar70,auVar132);
    fVar95 = auVar65._0_4_;
    fVar153 = auVar65._4_4_;
    auVar23._4_4_ = fVar153 * fVar150;
    auVar23._0_4_ = fVar95 * fVar134;
    auVar23._8_4_ = fVar95 * fVar151;
    auVar23._12_4_ = fVar153 * fVar152;
    auVar23._16_4_ = fVar95 * 0.0;
    auVar23._20_4_ = fVar153 * 0.0;
    auVar23._24_4_ = fVar95 * 0.0;
    auVar23._28_4_ = fVar63;
    auVar65 = vfmadd231ps_fma(auVar23,auVar70,auVar149);
    local_4e0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar203));
    fVar95 = auVar96._0_4_;
    fVar63 = auVar96._4_4_;
    auVar24._4_4_ = fVar63 * fVar150;
    auVar24._0_4_ = fVar95 * fVar134;
    auVar24._8_4_ = fVar95 * fVar151;
    auVar24._12_4_ = fVar63 * fVar152;
    auVar24._16_4_ = fVar95 * 0.0;
    auVar24._20_4_ = fVar63 * 0.0;
    auVar24._24_4_ = fVar95 * 0.0;
    auVar24._28_4_ = local_4e0._28_4_;
    auVar64 = vfmadd231ps_fma(auVar24,auVar70,auVar252);
    auVar16 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar75));
    auVar25._4_4_ = fVar150 * fStack_71c;
    auVar25._0_4_ = fVar134 * local_720;
    auVar25._8_4_ = fVar151 * local_720;
    auVar25._12_4_ = fVar152 * fStack_71c;
    auVar25._16_4_ = local_720 * 0.0;
    auVar25._20_4_ = fStack_71c * 0.0;
    auVar25._24_4_ = local_720 * 0.0;
    auVar25._28_4_ = fVar177;
    auVar96 = vfmadd231ps_fma(auVar25,auVar70,auVar272);
    auVar26._28_4_ = fVar63;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar152 * auVar10._12_4_,
                            CONCAT48(fVar151 * auVar10._8_4_,
                                     CONCAT44(fVar150 * auVar10._4_4_,fVar134 * auVar10._0_4_))));
    auVar269 = vfmadd231ps_fma(auVar26,auVar70,ZEXT1632(auVar269));
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar152 * auVar65._12_4_,
                                                CONCAT48(fVar151 * auVar65._8_4_,
                                                         CONCAT44(fVar150 * auVar65._4_4_,
                                                                  fVar134 * auVar65._0_4_)))),
                             auVar70,ZEXT1632(auVar9));
    fVar156 = auVar203._0_4_ + fVar156;
    fVar178 = auVar203._4_4_ + fVar178;
    fVar242 = auVar203._8_4_ + fVar242;
    fVar255 = auVar203._12_4_ + fVar255;
    fVar231 = fVar231 + 0.0;
    fVar232 = fVar232 + 0.0;
    fVar233 = fVar233 + 0.0;
    auVar27._28_4_ = 0x40400000;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar96._12_4_ * fVar152,
                            CONCAT48(auVar96._8_4_ * fVar151,
                                     CONCAT44(auVar96._4_4_ * fVar150,auVar96._0_4_ * fVar134))));
    auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar152 * auVar64._12_4_,
                                                 CONCAT48(fVar151 * auVar64._8_4_,
                                                          CONCAT44(fVar150 * auVar64._4_4_,
                                                                   fVar134 * auVar64._0_4_)))),
                              auVar70,ZEXT1632(auVar10));
    auVar65 = vfmadd231ps_fma(auVar27,auVar70,ZEXT1632(auVar65));
    auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar152 * auVar10._12_4_,
                                                 CONCAT48(fVar151 * auVar10._8_4_,
                                                          CONCAT44(fVar150 * auVar10._4_4_,
                                                                   fVar134 * auVar10._0_4_)))),
                              auVar70,ZEXT1632(auVar269));
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar152 * auVar65._12_4_,
                                                 CONCAT48(fVar151 * auVar65._8_4_,
                                                          CONCAT44(fVar150 * auVar65._4_4_,
                                                                   fVar134 * auVar65._0_4_)))),
                              ZEXT1632(auVar9),auVar70);
    auVar70 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar269));
    auVar15 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar9));
    fVar134 = fVar94 * auVar70._0_4_ * 3.0;
    fVar150 = fVar94 * auVar70._4_4_ * 3.0;
    auVar28._4_4_ = fVar150;
    auVar28._0_4_ = fVar134;
    fVar151 = fVar94 * auVar70._8_4_ * 3.0;
    auVar28._8_4_ = fVar151;
    fVar152 = fVar94 * auVar70._12_4_ * 3.0;
    auVar28._12_4_ = fVar152;
    fVar153 = fVar94 * auVar70._16_4_ * 3.0;
    auVar28._16_4_ = fVar153;
    fVar154 = fVar94 * auVar70._20_4_ * 3.0;
    auVar28._20_4_ = fVar154;
    fVar155 = fVar94 * auVar70._24_4_ * 3.0;
    auVar28._24_4_ = fVar155;
    auVar28._28_4_ = 0x40400000;
    auVar195._0_4_ = fVar94 * auVar15._0_4_ * 3.0;
    auVar195._4_4_ = fVar94 * auVar15._4_4_ * 3.0;
    auVar195._8_4_ = fVar94 * auVar15._8_4_ * 3.0;
    auVar195._12_4_ = fVar94 * auVar15._12_4_ * 3.0;
    auVar195._16_4_ = fVar94 * auVar15._16_4_ * 3.0;
    auVar195._20_4_ = fVar94 * auVar15._20_4_ * 3.0;
    auVar195._24_4_ = fVar94 * auVar15._24_4_ * 3.0;
    auVar195._28_4_ = 0;
    auVar17 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar64));
    local_1c0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar96));
    auVar70 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar203));
    auVar15 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar75));
    auVar72 = vsubps_avx(auVar17,local_4e0);
    fVar176 = auVar70._0_4_ + auVar72._0_4_;
    fVar179 = auVar70._4_4_ + auVar72._4_4_;
    fVar254 = auVar70._8_4_ + auVar72._8_4_;
    fVar256 = auVar70._12_4_ + auVar72._12_4_;
    fVar180 = auVar70._16_4_ + auVar72._16_4_;
    fVar181 = auVar70._20_4_ + auVar72._20_4_;
    fVar182 = auVar70._24_4_ + auVar72._24_4_;
    auVar14 = vsubps_avx(local_1c0,auVar16);
    auVar264._0_4_ = auVar15._0_4_ + auVar14._0_4_;
    auVar264._4_4_ = auVar15._4_4_ + auVar14._4_4_;
    auVar264._8_4_ = auVar15._8_4_ + auVar14._8_4_;
    auVar264._12_4_ = auVar15._12_4_ + auVar14._12_4_;
    auVar264._16_4_ = auVar15._16_4_ + auVar14._16_4_;
    auVar264._20_4_ = auVar15._20_4_ + auVar14._20_4_;
    auVar264._24_4_ = auVar15._24_4_ + auVar14._24_4_;
    auVar264._28_4_ = auVar15._28_4_ + auVar14._28_4_;
    fVar94 = auVar75._0_4_;
    local_2a0 = fVar94 + (float)local_700._0_4_;
    fVar95 = auVar75._4_4_;
    fStack_29c = fVar95 + (float)local_700._4_4_;
    fVar63 = auVar75._8_4_;
    fStack_298 = fVar63 + fStack_6f8;
    fVar177 = auVar75._12_4_;
    fStack_294 = fVar177 + fStack_6f4;
    fStack_290 = fStack_6f0 + 0.0;
    fStack_28c = fStack_6ec + 0.0;
    fStack_288 = fStack_6e8 + 0.0;
    fStack_284 = auVar71._28_4_ + 0.0;
    local_1e0 = ZEXT1632(auVar203);
    auVar15 = vsubps_avx(local_1e0,auVar19);
    local_220 = vpermps_avx2(_DAT_0205d4a0,auVar15);
    local_200 = ZEXT1632(auVar75);
    auVar15 = vsubps_avx(local_200,_local_700);
    local_2c0 = vpermps_avx2(_DAT_0205d4a0,auVar15);
    local_240._0_4_ = auVar64._0_4_ + fVar134;
    local_240._4_4_ = auVar64._4_4_ + fVar150;
    local_240._8_4_ = auVar64._8_4_ + fVar151;
    local_240._12_4_ = auVar64._12_4_ + fVar152;
    local_240._16_4_ = fVar153 + 0.0;
    local_240._20_4_ = fVar154 + 0.0;
    local_240._24_4_ = fVar155 + 0.0;
    local_240._28_4_ = 0x40400000;
    auVar253 = ZEXT1632(auVar64);
    auVar15 = vsubps_avx(auVar253,auVar28);
    auVar18 = vpermps_avx2(_DAT_0205d4a0,auVar15);
    fVar134 = auVar96._0_4_;
    local_280._0_4_ = fVar134 + auVar195._0_4_;
    fVar150 = auVar96._4_4_;
    local_280._4_4_ = fVar150 + auVar195._4_4_;
    fVar151 = auVar96._8_4_;
    local_280._8_4_ = fVar151 + auVar195._8_4_;
    fVar152 = auVar96._12_4_;
    local_280._12_4_ = fVar152 + auVar195._12_4_;
    local_280._16_4_ = auVar195._16_4_ + 0.0;
    local_280._20_4_ = auVar195._20_4_ + 0.0;
    local_280._24_4_ = auVar195._24_4_ + 0.0;
    local_280._28_4_ = 0;
    auVar15 = vsubps_avx(ZEXT1632(auVar96),auVar195);
    local_260 = vpermps_avx2(_DAT_0205d4a0,auVar15);
    auVar29._4_4_ = fVar95 * fVar179;
    auVar29._0_4_ = fVar94 * fVar176;
    auVar29._8_4_ = fVar63 * fVar254;
    auVar29._12_4_ = fVar177 * fVar256;
    auVar29._16_4_ = fVar180 * 0.0;
    auVar29._20_4_ = fVar181 * 0.0;
    auVar29._24_4_ = fVar182 * 0.0;
    auVar29._28_4_ = auVar15._28_4_;
    auVar9 = vfnmadd231ps_fma(auVar29,local_1e0,auVar264);
    auVar30._4_4_ = fStack_29c * fVar179;
    auVar30._0_4_ = local_2a0 * fVar176;
    auVar30._8_4_ = fStack_298 * fVar254;
    auVar30._12_4_ = fStack_294 * fVar256;
    auVar30._16_4_ = fStack_290 * fVar180;
    auVar30._20_4_ = fStack_28c * fVar181;
    auVar30._24_4_ = fStack_288 * fVar182;
    auVar30._28_4_ = auVar18._28_4_;
    auVar43._4_4_ = fVar178;
    auVar43._0_4_ = fVar156;
    auVar43._8_4_ = fVar242;
    auVar43._12_4_ = fVar255;
    auVar43._16_4_ = fVar231;
    auVar43._20_4_ = fVar232;
    auVar43._24_4_ = fVar233;
    auVar43._28_4_ = 0x40400000;
    auVar10 = vfnmadd231ps_fma(auVar30,auVar264,auVar43);
    auVar31._4_4_ = local_2c0._4_4_ * fVar179;
    auVar31._0_4_ = local_2c0._0_4_ * fVar176;
    auVar31._8_4_ = local_2c0._8_4_ * fVar254;
    auVar31._12_4_ = local_2c0._12_4_ * fVar256;
    auVar31._16_4_ = local_2c0._16_4_ * fVar180;
    auVar31._20_4_ = local_2c0._20_4_ * fVar181;
    auVar31._24_4_ = local_2c0._24_4_ * fVar182;
    auVar31._28_4_ = fStack_284;
    auVar269 = vfnmadd231ps_fma(auVar31,local_220,auVar264);
    local_6e0._0_4_ = auVar16._0_4_;
    local_6e0._4_4_ = auVar16._4_4_;
    uStack_6d8._0_4_ = auVar16._8_4_;
    uStack_6d8._4_4_ = auVar16._12_4_;
    uStack_6d0._0_4_ = auVar16._16_4_;
    uStack_6d0._4_4_ = auVar16._20_4_;
    uStack_6c8._0_4_ = auVar16._24_4_;
    auVar32._4_4_ = fVar179 * (float)local_6e0._4_4_;
    auVar32._0_4_ = fVar176 * (float)local_6e0._0_4_;
    auVar32._8_4_ = fVar254 * (float)uStack_6d8;
    auVar32._12_4_ = fVar256 * uStack_6d8._4_4_;
    auVar32._16_4_ = fVar180 * (float)uStack_6d0;
    auVar32._20_4_ = fVar181 * uStack_6d0._4_4_;
    auVar32._24_4_ = fVar182 * (float)uStack_6c8;
    auVar32._28_4_ = local_2c0._28_4_;
    auVar65 = vfnmadd231ps_fma(auVar32,local_4e0,auVar264);
    auVar49._4_4_ = fVar150 * fVar179;
    auVar49._0_4_ = fVar134 * fVar176;
    auVar49._8_4_ = fVar151 * fVar254;
    auVar49._12_4_ = fVar152 * fVar256;
    auVar49._16_4_ = fVar180 * 0.0;
    auVar49._20_4_ = fVar181 * 0.0;
    auVar49._24_4_ = fVar182 * 0.0;
    auVar49._28_4_ = DAT_0205d4a0._28_4_;
    auVar64 = vfnmadd231ps_fma(auVar49,auVar253,auVar264);
    auVar33._4_4_ = local_280._4_4_ * fVar179;
    auVar33._0_4_ = local_280._0_4_ * fVar176;
    auVar33._8_4_ = local_280._8_4_ * fVar254;
    auVar33._12_4_ = local_280._12_4_ * fVar256;
    auVar33._16_4_ = local_280._16_4_ * fVar180;
    auVar33._20_4_ = local_280._20_4_ * fVar181;
    auVar33._24_4_ = local_280._24_4_ * fVar182;
    auVar33._28_4_ = local_4e0._28_4_;
    auVar74 = vfnmadd231ps_fma(auVar33,local_240,auVar264);
    auVar34._4_4_ = local_260._4_4_ * fVar179;
    auVar34._0_4_ = local_260._0_4_ * fVar176;
    auVar34._8_4_ = local_260._8_4_ * fVar254;
    auVar34._12_4_ = local_260._12_4_ * fVar256;
    auVar34._16_4_ = local_260._16_4_ * fVar180;
    auVar34._20_4_ = local_260._20_4_ * fVar181;
    auVar34._24_4_ = local_260._24_4_ * fVar182;
    auVar34._28_4_ = local_220._28_4_;
    auVar203 = vfnmadd231ps_fma(auVar34,auVar264,auVar18);
    auVar35._4_4_ = local_1c0._4_4_ * fVar179;
    auVar35._0_4_ = local_1c0._0_4_ * fVar176;
    auVar35._8_4_ = local_1c0._8_4_ * fVar254;
    auVar35._12_4_ = local_1c0._12_4_ * fVar256;
    auVar35._16_4_ = local_1c0._16_4_ * fVar180;
    auVar35._20_4_ = local_1c0._20_4_ * fVar181;
    auVar35._24_4_ = local_1c0._24_4_ * fVar182;
    auVar35._28_4_ = auVar70._28_4_ + auVar72._28_4_;
    auVar75 = vfnmadd231ps_fma(auVar35,auVar264,auVar17);
    auVar15 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
    auVar70 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
    auVar71 = vminps_avx(ZEXT1632(auVar269),ZEXT1632(auVar65));
    auVar71 = vminps_avx(auVar15,auVar71);
    auVar15 = vmaxps_avx(ZEXT1632(auVar269),ZEXT1632(auVar65));
    auVar70 = vmaxps_avx(auVar70,auVar15);
    auVar72 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar74));
    auVar15 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar74));
    auVar14 = vminps_avx(ZEXT1632(auVar203),ZEXT1632(auVar75));
    auVar72 = vminps_avx(auVar72,auVar14);
    auVar72 = vminps_avx(auVar71,auVar72);
    auVar71 = vmaxps_avx(ZEXT1632(auVar203),ZEXT1632(auVar75));
    auVar15 = vmaxps_avx(auVar15,auVar71);
    auVar15 = vmaxps_avx(auVar70,auVar15);
    auVar48._4_4_ = fStack_2dc;
    auVar48._0_4_ = local_2e0;
    auVar48._8_4_ = fStack_2d8;
    auVar48._12_4_ = fStack_2d4;
    auVar48._16_4_ = fStack_2d0;
    auVar48._20_4_ = fStack_2cc;
    auVar48._24_4_ = fStack_2c8;
    auVar48._28_4_ = fStack_2c4;
    auVar70 = vcmpps_avx(auVar72,auVar48,2);
    auVar47._4_4_ = fStack_2fc;
    auVar47._0_4_ = local_300;
    auVar47._8_4_ = fStack_2f8;
    auVar47._12_4_ = fStack_2f4;
    auVar47._16_4_ = fStack_2f0;
    auVar47._20_4_ = fStack_2ec;
    auVar47._24_4_ = fStack_2e8;
    auVar47._28_4_ = fStack_2e4;
    auVar15 = vcmpps_avx(auVar15,auVar47,5);
    auVar70 = vandps_avx(auVar15,auVar70);
    auVar15 = local_3a0 & auVar70;
    uVar52 = 0;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar15 = vsubps_avx(local_4e0,local_1e0);
      auVar71 = vsubps_avx(auVar17,auVar253);
      fVar154 = auVar15._0_4_ + auVar71._0_4_;
      fVar155 = auVar15._4_4_ + auVar71._4_4_;
      fVar176 = auVar15._8_4_ + auVar71._8_4_;
      fVar179 = auVar15._12_4_ + auVar71._12_4_;
      fVar254 = auVar15._16_4_ + auVar71._16_4_;
      fVar256 = auVar15._20_4_ + auVar71._20_4_;
      fVar180 = auVar15._24_4_ + auVar71._24_4_;
      auVar72 = vsubps_avx(auVar16,local_200);
      auVar14 = vsubps_avx(local_1c0,ZEXT1632(auVar96));
      auVar91._0_4_ = auVar72._0_4_ + auVar14._0_4_;
      auVar91._4_4_ = auVar72._4_4_ + auVar14._4_4_;
      auVar91._8_4_ = auVar72._8_4_ + auVar14._8_4_;
      auVar91._12_4_ = auVar72._12_4_ + auVar14._12_4_;
      auVar91._16_4_ = auVar72._16_4_ + auVar14._16_4_;
      auVar91._20_4_ = auVar72._20_4_ + auVar14._20_4_;
      auVar91._24_4_ = auVar72._24_4_ + auVar14._24_4_;
      fVar153 = auVar14._28_4_;
      auVar91._28_4_ = auVar72._28_4_ + fVar153;
      auVar273._0_4_ = fVar94 * fVar154;
      auVar273._4_4_ = fVar95 * fVar155;
      auVar273._8_4_ = fVar63 * fVar176;
      auVar273._12_4_ = fVar177 * fVar179;
      auVar273._16_4_ = fVar254 * 0.0;
      auVar273._20_4_ = fVar256 * 0.0;
      auVar273._24_4_ = fVar180 * 0.0;
      auVar273._28_4_ = 0;
      auVar64 = vfnmadd231ps_fma(auVar273,auVar91,local_1e0);
      auVar36._4_4_ = fVar155 * fStack_29c;
      auVar36._0_4_ = fVar154 * local_2a0;
      auVar36._8_4_ = fVar176 * fStack_298;
      auVar36._12_4_ = fVar179 * fStack_294;
      auVar36._16_4_ = fVar254 * fStack_290;
      auVar36._20_4_ = fVar256 * fStack_28c;
      auVar36._24_4_ = fVar180 * fStack_288;
      auVar36._28_4_ = fVar153;
      auVar44._4_4_ = fVar178;
      auVar44._0_4_ = fVar156;
      auVar44._8_4_ = fVar242;
      auVar44._12_4_ = fVar255;
      auVar44._16_4_ = fVar231;
      auVar44._20_4_ = fVar232;
      auVar44._24_4_ = fVar233;
      auVar44._28_4_ = 0x40400000;
      auVar9 = vfnmadd213ps_fma(auVar44,auVar91,auVar36);
      auVar37._4_4_ = fVar155 * local_2c0._4_4_;
      auVar37._0_4_ = fVar154 * local_2c0._0_4_;
      auVar37._8_4_ = fVar176 * local_2c0._8_4_;
      auVar37._12_4_ = fVar179 * local_2c0._12_4_;
      auVar37._16_4_ = fVar254 * local_2c0._16_4_;
      auVar37._20_4_ = fVar256 * local_2c0._20_4_;
      auVar37._24_4_ = fVar180 * local_2c0._24_4_;
      auVar37._28_4_ = fVar153;
      auVar10 = vfnmadd213ps_fma(local_220,auVar91,auVar37);
      auVar38._4_4_ = (float)local_6e0._4_4_ * fVar155;
      auVar38._0_4_ = (float)local_6e0._0_4_ * fVar154;
      auVar38._8_4_ = (float)uStack_6d8 * fVar176;
      auVar38._12_4_ = uStack_6d8._4_4_ * fVar179;
      auVar38._16_4_ = (float)uStack_6d0 * fVar254;
      auVar38._20_4_ = uStack_6d0._4_4_ * fVar256;
      auVar38._24_4_ = (float)uStack_6c8 * fVar180;
      auVar38._28_4_ = fVar153;
      auVar96 = vfnmadd231ps_fma(auVar38,auVar91,local_4e0);
      auVar105._0_4_ = fVar134 * fVar154;
      auVar105._4_4_ = fVar150 * fVar155;
      auVar105._8_4_ = fVar151 * fVar176;
      auVar105._12_4_ = fVar152 * fVar179;
      auVar105._16_4_ = fVar254 * 0.0;
      auVar105._20_4_ = fVar256 * 0.0;
      auVar105._24_4_ = fVar180 * 0.0;
      auVar105._28_4_ = 0;
      auVar74 = vfnmadd231ps_fma(auVar105,auVar91,auVar253);
      auVar39._4_4_ = fVar155 * local_280._4_4_;
      auVar39._0_4_ = fVar154 * local_280._0_4_;
      auVar39._8_4_ = fVar176 * local_280._8_4_;
      auVar39._12_4_ = fVar179 * local_280._12_4_;
      auVar39._16_4_ = fVar254 * local_280._16_4_;
      auVar39._20_4_ = fVar256 * local_280._20_4_;
      auVar39._24_4_ = fVar180 * local_280._24_4_;
      auVar39._28_4_ = auVar16._28_4_;
      auVar269 = vfnmadd213ps_fma(local_240,auVar91,auVar39);
      auVar40._4_4_ = fVar155 * local_260._4_4_;
      auVar40._0_4_ = fVar154 * local_260._0_4_;
      auVar40._8_4_ = fVar176 * local_260._8_4_;
      auVar40._12_4_ = fVar179 * local_260._12_4_;
      auVar40._16_4_ = fVar254 * local_260._16_4_;
      auVar40._20_4_ = fVar256 * local_260._20_4_;
      auVar40._24_4_ = fVar180 * local_260._24_4_;
      auVar40._28_4_ = auVar16._28_4_;
      auVar65 = vfnmadd213ps_fma(auVar18,auVar91,auVar40);
      auVar41._4_4_ = local_1c0._4_4_ * fVar155;
      auVar41._0_4_ = local_1c0._0_4_ * fVar154;
      auVar41._8_4_ = local_1c0._8_4_ * fVar176;
      auVar41._12_4_ = local_1c0._12_4_ * fVar179;
      auVar41._16_4_ = local_1c0._16_4_ * fVar254;
      auVar41._20_4_ = local_1c0._20_4_ * fVar256;
      auVar41._24_4_ = local_1c0._24_4_ * fVar180;
      auVar41._28_4_ = auVar15._28_4_ + auVar71._28_4_;
      auVar203 = vfnmadd231ps_fma(auVar41,auVar91,auVar17);
      auVar71 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar9));
      auVar15 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar9));
      auVar72 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar96));
      auVar72 = vminps_avx(auVar71,auVar72);
      auVar71 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar96));
      auVar15 = vmaxps_avx(auVar15,auVar71);
      auVar14 = vminps_avx(ZEXT1632(auVar74),ZEXT1632(auVar269));
      auVar71 = vmaxps_avx(ZEXT1632(auVar74),ZEXT1632(auVar269));
      auVar16 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar203));
      auVar14 = vminps_avx(auVar14,auVar16);
      auVar14 = vminps_avx(auVar72,auVar14);
      auVar72 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar203));
      auVar71 = vmaxps_avx(auVar71,auVar72);
      auVar71 = vmaxps_avx(auVar15,auVar71);
      auVar15 = vcmpps_avx(auVar14,auVar48,2);
      auVar71 = vcmpps_avx(auVar71,auVar47,5);
      auVar15 = vandps_avx(auVar71,auVar15);
      auVar70 = vandps_avx(auVar70,local_3a0);
      auVar71 = auVar70 & auVar15;
      if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar71 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar71 >> 0x7f,0) != '\0') ||
            (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar71 >> 0xbf,0) != '\0') ||
          (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar71[0x1f] < '\0') {
        auVar70 = vandps_avx(auVar15,auVar70);
        uVar52 = vmovmskps_avx(auVar70);
      }
    }
    if (uVar52 != 0) {
      auStack_4f0[uVar54] = uVar52;
      uVar157 = vmovlps_avx(local_450);
      *(undefined8 *)(&uStack_380 + uVar54 * 2) = uVar157;
      uVar59 = vmovlps_avx(local_780);
      auStack_1a0[uVar54] = uVar59;
      uVar54 = (ulong)((int)uVar54 + 1);
    }
    do {
      if ((int)uVar54 == 0) {
        uVar62 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar69._4_4_ = uVar62;
        auVar69._0_4_ = uVar62;
        auVar69._8_4_ = uVar62;
        auVar69._12_4_ = uVar62;
        auVar9 = vcmpps_avx(local_4a0,auVar69,2);
        uVar50 = vmovmskps_avx(auVar9);
        uVar50 = (uint)uVar60 & uVar50;
        if (uVar50 == 0) {
          return;
        }
        goto LAB_01683d52;
      }
      uVar53 = (int)uVar54 - 1;
      uVar55 = (ulong)uVar53;
      uVar58 = auStack_4f0[uVar55];
      uVar52 = (&uStack_380)[uVar55 * 2];
      fVar134 = afStack_37c[uVar55 * 2];
      iVar51 = 0;
      for (uVar59 = (ulong)uVar58; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
        iVar51 = iVar51 + 1;
      }
      uVar58 = uVar58 - 1 & uVar58;
      if (uVar58 == 0) {
        uVar54 = (ulong)uVar53;
      }
      local_780._8_8_ = 0;
      local_780._0_8_ = auStack_1a0[uVar55];
      auStack_4f0[uVar55] = uVar58;
      fVar150 = (float)(iVar51 + 1) * 0.14285715;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * (float)iVar51 * 0.14285715)),ZEXT416(uVar52)
                               ,ZEXT416((uint)(1.0 - (float)iVar51 * 0.14285715)));
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * fVar150)),ZEXT416(uVar52),
                                ZEXT416((uint)(1.0 - fVar150)));
      auVar175._0_4_ = auVar9._0_4_;
      fVar150 = auVar10._0_4_;
      fVar134 = fVar150 - auVar175._0_4_;
      if (0.16666667 <= fVar134) break;
      auVar269 = vshufps_avx(local_780,local_780,0x50);
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = &DAT_3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar65 = vsubps_avx(auVar98,auVar269);
      fVar151 = auVar269._0_4_;
      auVar110._0_4_ = fVar151 * (float)local_540._0_4_;
      fVar152 = auVar269._4_4_;
      auVar110._4_4_ = fVar152 * (float)local_540._4_4_;
      fVar94 = auVar269._8_4_;
      auVar110._8_4_ = fVar94 * fStack_538;
      fVar95 = auVar269._12_4_;
      auVar110._12_4_ = fVar95 * fStack_534;
      auVar123._0_4_ = fVar151 * (float)local_550._0_4_;
      auVar123._4_4_ = fVar152 * (float)local_550._4_4_;
      auVar123._8_4_ = fVar94 * fStack_548;
      auVar123._12_4_ = fVar95 * fStack_544;
      auVar143._0_4_ = fVar151 * (float)local_560._0_4_;
      auVar143._4_4_ = fVar152 * (float)local_560._4_4_;
      auVar143._8_4_ = fVar94 * fStack_558;
      auVar143._12_4_ = fVar95 * fStack_554;
      auVar83._0_4_ = fVar151 * (float)local_570._0_4_;
      auVar83._4_4_ = fVar152 * (float)local_570._4_4_;
      auVar83._8_4_ = fVar94 * fStack_568;
      auVar83._12_4_ = fVar95 * fStack_564;
      auVar269 = vfmadd231ps_fma(auVar110,auVar65,local_500);
      auVar64 = vfmadd231ps_fma(auVar123,auVar65,local_510);
      auVar96 = vfmadd231ps_fma(auVar143,auVar65,local_520);
      auVar65 = vfmadd231ps_fma(auVar83,auVar65,local_530);
      auVar106._16_16_ = auVar269;
      auVar106._0_16_ = auVar269;
      auVar118._16_16_ = auVar64;
      auVar118._0_16_ = auVar64;
      auVar133._16_16_ = auVar96;
      auVar133._0_16_ = auVar96;
      auVar175._4_4_ = auVar175._0_4_;
      auVar175._8_4_ = auVar175._0_4_;
      auVar175._12_4_ = auVar175._0_4_;
      auVar175._20_4_ = fVar150;
      auVar175._16_4_ = fVar150;
      auVar175._24_4_ = fVar150;
      auVar175._28_4_ = fVar150;
      auVar70 = vsubps_avx(auVar118,auVar106);
      auVar64 = vfmadd213ps_fma(auVar70,auVar175,auVar106);
      auVar70 = vsubps_avx(auVar133,auVar118);
      auVar74 = vfmadd213ps_fma(auVar70,auVar175,auVar118);
      auVar269 = vsubps_avx(auVar65,auVar96);
      auVar119._16_16_ = auVar269;
      auVar119._0_16_ = auVar269;
      auVar269 = vfmadd213ps_fma(auVar119,auVar175,auVar133);
      auVar70 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar64));
      auVar65 = vfmadd213ps_fma(auVar70,auVar175,ZEXT1632(auVar64));
      auVar70 = vsubps_avx(ZEXT1632(auVar269),ZEXT1632(auVar74));
      auVar269 = vfmadd213ps_fma(auVar70,auVar175,ZEXT1632(auVar74));
      auVar70 = vsubps_avx(ZEXT1632(auVar269),ZEXT1632(auVar65));
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar70,auVar175);
      fVar177 = auVar70._4_4_ * 3.0;
      fVar63 = fVar134 * 0.33333334;
      local_4e0._0_8_ =
           CONCAT44(auVar107._4_4_ + fVar63 * fVar177,auVar107._0_4_ + fVar63 * auVar70._0_4_ * 3.0)
      ;
      local_4e0._8_4_ = auVar107._8_4_ + fVar63 * auVar70._8_4_ * 3.0;
      local_4e0._12_4_ = auVar107._12_4_ + fVar63 * auVar70._12_4_ * 3.0;
      auVar65 = vshufpd_avx(auVar107,auVar107,3);
      auVar64 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar269 = vsubps_avx(auVar65,auVar107);
      auVar96 = vsubps_avx(auVar64,(undefined1  [16])0x0);
      auVar99._0_4_ = auVar269._0_4_ + auVar96._0_4_;
      auVar99._4_4_ = auVar269._4_4_ + auVar96._4_4_;
      auVar99._8_4_ = auVar269._8_4_ + auVar96._8_4_;
      auVar99._12_4_ = auVar269._12_4_ + auVar96._12_4_;
      auVar269 = vshufps_avx(auVar107,auVar107,0xb1);
      auVar96 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
      auVar257._4_4_ = auVar99._0_4_;
      auVar257._0_4_ = auVar99._0_4_;
      auVar257._8_4_ = auVar99._0_4_;
      auVar257._12_4_ = auVar99._0_4_;
      auVar74 = vshufps_avx(auVar99,auVar99,0x55);
      fVar151 = auVar74._0_4_;
      auVar187._0_4_ = auVar269._0_4_ * fVar151;
      fVar152 = auVar74._4_4_;
      auVar187._4_4_ = auVar269._4_4_ * fVar152;
      fVar94 = auVar74._8_4_;
      auVar187._8_4_ = auVar269._8_4_ * fVar94;
      fVar95 = auVar74._12_4_;
      auVar187._12_4_ = auVar269._12_4_ * fVar95;
      auVar201._0_4_ = auVar96._0_4_ * fVar151;
      auVar201._4_4_ = auVar96._4_4_ * fVar152;
      auVar201._8_4_ = auVar96._8_4_ * fVar94;
      auVar201._12_4_ = auVar96._12_4_ * fVar95;
      auVar203 = vfmadd231ps_fma(auVar187,auVar257,auVar107);
      auVar75 = vfmadd231ps_fma(auVar201,auVar257,local_4e0._0_16_);
      auVar96 = vshufps_avx(auVar203,auVar203,0xe8);
      auVar74 = vshufps_avx(auVar75,auVar75,0xe8);
      auVar269 = vcmpps_avx(auVar96,auVar74,1);
      uVar52 = vextractps_avx(auVar269,0);
      auVar121 = auVar75;
      if ((uVar52 & 1) == 0) {
        auVar121 = auVar203;
      }
      auVar124._0_4_ = fVar63 * auVar70._16_4_ * 3.0;
      auVar124._4_4_ = fVar63 * fVar177;
      auVar124._8_4_ = fVar63 * auVar70._24_4_ * 3.0;
      auVar124._12_4_ = fVar63 * fVar150;
      auVar135 = vsubps_avx((undefined1  [16])0x0,auVar124);
      auVar125 = vshufps_avx(auVar135,auVar135,0xb1);
      auVar73 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar275._0_4_ = auVar125._0_4_ * fVar151;
      auVar275._4_4_ = auVar125._4_4_ * fVar152;
      auVar275._8_4_ = auVar125._8_4_ * fVar94;
      auVar275._12_4_ = auVar125._12_4_ * fVar95;
      auVar100._0_4_ = auVar73._0_4_ * fVar151;
      auVar100._4_4_ = auVar73._4_4_ * fVar152;
      auVar100._8_4_ = auVar73._8_4_ * fVar94;
      auVar100._12_4_ = auVar73._12_4_ * fVar95;
      auVar136 = vfmadd231ps_fma(auVar275,auVar257,auVar135);
      auVar137 = vfmadd231ps_fma(auVar100,(undefined1  [16])0x0,auVar257);
      auVar73 = vshufps_avx(auVar136,auVar136,0xe8);
      auVar120 = vshufps_avx(auVar137,auVar137,0xe8);
      auVar125 = vcmpps_avx(auVar73,auVar120,1);
      uVar52 = vextractps_avx(auVar125,0);
      auVar183 = auVar137;
      if ((uVar52 & 1) == 0) {
        auVar183 = auVar136;
      }
      auVar121 = vmaxss_avx(auVar183,auVar121);
      auVar96 = vminps_avx(auVar96,auVar74);
      auVar74 = vminps_avx(auVar73,auVar120);
      auVar74 = vminps_avx(auVar96,auVar74);
      auVar269 = vshufps_avx(auVar269,auVar269,0x55);
      auVar269 = vblendps_avx(auVar269,auVar125,2);
      auVar125 = vpslld_avx(auVar269,0x1f);
      auVar269 = vshufpd_avx(auVar75,auVar75,1);
      auVar269 = vinsertps_avx(auVar269,auVar137,0x9c);
      auVar96 = vshufpd_avx(auVar203,auVar203,1);
      auVar96 = vinsertps_avx(auVar96,auVar136,0x9c);
      auVar269 = vblendvps_avx(auVar96,auVar269,auVar125);
      auVar96 = vmovshdup_avx(auVar269);
      auVar269 = vmaxss_avx(auVar96,auVar269);
      fVar94 = auVar74._0_4_;
      auVar96 = vmovshdup_avx(auVar74);
      fVar152 = auVar269._0_4_;
      fVar151 = auVar121._0_4_;
      if ((0.0001 <= fVar94) || (fVar152 <= -0.0001)) {
        auVar203 = vcmpps_avx(auVar96,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar75 = vcmpps_avx(auVar74,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar203 = vorps_avx(auVar75,auVar203);
        if ((-0.0001 < fVar151 & auVar203[0]) != 0) goto LAB_01684e48;
        auVar203 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar269,5);
        auVar75 = vcmpps_avx(auVar96,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar203 = vorps_avx(auVar75,auVar203);
        if ((auVar203 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_01684e48;
LAB_016857fe:
        bVar42 = true;
      }
      else {
LAB_01684e48:
        auVar75 = vcmpps_avx(auVar74,_DAT_01feba10,1);
        auVar125 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar203 = vcmpss_avx(auVar121,ZEXT816(0) << 0x20,1);
        auVar144._8_4_ = 0x3f800000;
        auVar144._0_8_ = &DAT_3f8000003f800000;
        auVar144._12_4_ = 0x3f800000;
        auVar202._8_4_ = 0xbf800000;
        auVar202._0_8_ = 0xbf800000bf800000;
        auVar202._12_4_ = 0xbf800000;
        auVar203 = vblendvps_avx(auVar144,auVar202,auVar203);
        auVar75 = vblendvps_avx(auVar144,auVar202,auVar75);
        fVar95 = auVar75._0_4_;
        fVar63 = auVar203._0_4_;
        auVar203 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar95 == fVar63) && (!NAN(fVar95) && !NAN(fVar63))) {
          auVar203 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar73 = ZEXT816(0) << 0x20;
        if ((fVar95 == fVar63) && (!NAN(fVar95) && !NAN(fVar63))) {
          auVar125 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar75 = vmovshdup_avx(auVar75);
        fVar177 = auVar75._0_4_;
        if ((fVar95 != fVar177) || (NAN(fVar95) || NAN(fVar177))) {
          fVar95 = auVar96._0_4_;
          if ((fVar95 != fVar94) || (NAN(fVar95) || NAN(fVar94))) {
            auVar101._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
            auVar101._8_4_ = auVar74._8_4_ ^ 0x80000000;
            auVar101._12_4_ = auVar74._12_4_ ^ 0x80000000;
            auVar126._0_4_ = -fVar94 / (fVar95 - fVar94);
            auVar126._4_12_ = auVar101._4_12_;
            auVar96 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar73,auVar126);
            auVar74 = auVar96;
          }
          else {
            auVar96 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar94 == 0.0) && (auVar96 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar94))) {
              auVar96 = ZEXT816(0);
            }
            auVar74 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar94 == 0.0) && (auVar74 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar94))) {
              auVar74 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar203 = vminss_avx(auVar203,auVar96);
          auVar125 = vmaxss_avx(auVar74,auVar125);
        }
        auVar269 = vcmpss_avx(auVar269,auVar73,1);
        auVar127._8_4_ = 0x3f800000;
        auVar127._0_8_ = &DAT_3f8000003f800000;
        auVar127._12_4_ = 0x3f800000;
        auVar145._8_4_ = 0xbf800000;
        auVar145._0_8_ = 0xbf800000bf800000;
        auVar145._12_4_ = 0xbf800000;
        auVar269 = vblendvps_avx(auVar127,auVar145,auVar269);
        fVar94 = auVar269._0_4_;
        auVar269 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar63 != fVar94) || (NAN(fVar63) || NAN(fVar94))) {
          if ((fVar152 != fVar151) || (NAN(fVar152) || NAN(fVar151))) {
            auVar102._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
            auVar102._8_4_ = auVar121._8_4_ ^ 0x80000000;
            auVar102._12_4_ = auVar121._12_4_ ^ 0x80000000;
            auVar128._0_4_ = -fVar151 / (fVar152 - fVar151);
            auVar128._4_12_ = auVar102._4_12_;
            auVar96 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar73,auVar128);
            auVar74 = auVar96;
          }
          else {
            auVar96 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar151 == 0.0) && (auVar96 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar151))) {
              auVar96 = ZEXT816(0);
            }
            auVar74 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar151 == 0.0) && (auVar74 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar151))) {
              auVar74 = auVar269;
            }
          }
          auVar203 = vminss_avx(auVar203,auVar96);
          auVar125 = vmaxss_avx(auVar74,auVar125);
        }
        if ((fVar177 != fVar94) || (NAN(fVar177) || NAN(fVar94))) {
          auVar203 = vminss_avx(auVar203,auVar269);
          auVar125 = vmaxss_avx(auVar269,auVar125);
        }
        auVar96 = vmaxss_avx(auVar73,auVar203);
        auVar74 = vminss_avx(auVar125,auVar269);
        bVar42 = true;
        if (auVar96._0_4_ <= auVar74._0_4_) {
          auVar96 = vmaxss_avx(auVar73,ZEXT416((uint)(auVar96._0_4_ + -0.1)));
          auVar269 = vminss_avx(ZEXT416((uint)(auVar74._0_4_ + 0.1)),auVar269);
          auVar84._0_8_ = auVar107._0_8_;
          auVar84._8_8_ = auVar84._0_8_;
          auVar204._8_8_ = local_4e0._0_8_;
          auVar204._0_8_ = local_4e0._0_8_;
          auVar219._8_8_ = auVar135._0_8_;
          auVar219._0_8_ = auVar135._0_8_;
          auVar74 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
          auVar203 = vshufpd_avx(auVar135,auVar135,3);
          auVar75 = vshufps_avx(auVar96,auVar269,0);
          auVar111._8_4_ = 0x3f800000;
          auVar111._0_8_ = &DAT_3f8000003f800000;
          auVar111._12_4_ = 0x3f800000;
          auVar107 = vsubps_avx(auVar111,auVar75);
          local_700._0_4_ = auVar65._0_4_;
          local_700._4_4_ = auVar65._4_4_;
          fStack_6f8 = auVar65._8_4_;
          fStack_6f4 = auVar65._12_4_;
          fVar151 = auVar75._0_4_;
          auVar112._0_4_ = fVar151 * (float)local_700._0_4_;
          fVar152 = auVar75._4_4_;
          auVar112._4_4_ = fVar152 * (float)local_700._4_4_;
          fVar94 = auVar75._8_4_;
          auVar112._8_4_ = fVar94 * fStack_6f8;
          fVar95 = auVar75._12_4_;
          auVar112._12_4_ = fVar95 * fStack_6f4;
          auVar129._0_4_ = auVar74._0_4_ * fVar151;
          auVar129._4_4_ = auVar74._4_4_ * fVar152;
          auVar129._8_4_ = auVar74._8_4_ * fVar94;
          auVar129._12_4_ = auVar74._12_4_ * fVar95;
          auVar146._0_4_ = auVar203._0_4_ * fVar151;
          auVar146._4_4_ = auVar203._4_4_ * fVar152;
          auVar146._8_4_ = auVar203._8_4_ * fVar94;
          auVar146._12_4_ = auVar203._12_4_ * fVar95;
          local_6e0._0_4_ = auVar64._0_4_;
          local_6e0._4_4_ = auVar64._4_4_;
          uStack_6d8._0_4_ = auVar64._8_4_;
          uStack_6d8._4_4_ = auVar64._12_4_;
          auVar169._0_4_ = fVar151 * (float)local_6e0._0_4_;
          auVar169._4_4_ = fVar152 * (float)local_6e0._4_4_;
          auVar169._8_4_ = fVar94 * (float)uStack_6d8;
          auVar169._12_4_ = fVar95 * uStack_6d8._4_4_;
          auVar74 = vfmadd231ps_fma(auVar112,auVar107,auVar84);
          auVar203 = vfmadd231ps_fma(auVar129,auVar107,auVar204);
          auVar75 = vfmadd231ps_fma(auVar146,auVar107,auVar219);
          auVar107 = vfmadd231ps_fma(auVar169,auVar107,ZEXT816(0));
          auVar65 = vmovshdup_avx(local_780);
          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar96._0_4_)),local_780,
                                    ZEXT416((uint)(1.0 - auVar96._0_4_)));
          auVar120 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar269._0_4_)),local_780,
                                     ZEXT416((uint)(1.0 - auVar269._0_4_)));
          fVar151 = 1.0 / fVar134;
          auVar269 = vsubps_avx(auVar203,auVar74);
          auVar188._0_4_ = auVar269._0_4_ * 3.0;
          auVar188._4_4_ = auVar269._4_4_ * 3.0;
          auVar188._8_4_ = auVar269._8_4_ * 3.0;
          auVar188._12_4_ = auVar269._12_4_ * 3.0;
          auVar269 = vsubps_avx(auVar75,auVar203);
          auVar205._0_4_ = auVar269._0_4_ * 3.0;
          auVar205._4_4_ = auVar269._4_4_ * 3.0;
          auVar205._8_4_ = auVar269._8_4_ * 3.0;
          auVar205._12_4_ = auVar269._12_4_ * 3.0;
          auVar269 = vsubps_avx(auVar107,auVar75);
          auVar220._0_4_ = auVar269._0_4_ * 3.0;
          auVar220._4_4_ = auVar269._4_4_ * 3.0;
          auVar220._8_4_ = auVar269._8_4_ * 3.0;
          auVar220._12_4_ = auVar269._12_4_ * 3.0;
          auVar65 = vminps_avx(auVar205,auVar220);
          auVar269 = vmaxps_avx(auVar205,auVar220);
          auVar65 = vminps_avx(auVar188,auVar65);
          auVar269 = vmaxps_avx(auVar188,auVar269);
          auVar64 = vshufpd_avx(auVar65,auVar65,3);
          auVar96 = vshufpd_avx(auVar269,auVar269,3);
          auVar65 = vminps_avx(auVar65,auVar64);
          auVar269 = vmaxps_avx(auVar269,auVar96);
          auVar206._0_4_ = auVar65._0_4_ * fVar151;
          auVar206._4_4_ = auVar65._4_4_ * fVar151;
          auVar206._8_4_ = auVar65._8_4_ * fVar151;
          auVar206._12_4_ = auVar65._12_4_ * fVar151;
          auVar189._0_4_ = fVar151 * auVar269._0_4_;
          auVar189._4_4_ = fVar151 * auVar269._4_4_;
          auVar189._8_4_ = fVar151 * auVar269._8_4_;
          auVar189._12_4_ = fVar151 * auVar269._12_4_;
          fVar151 = 1.0 / (auVar120._0_4_ - auVar73._0_4_);
          auVar269 = vshufpd_avx(auVar74,auVar74,3);
          auVar65 = vshufpd_avx(auVar203,auVar203,3);
          auVar64 = vshufpd_avx(auVar75,auVar75,3);
          auVar96 = vshufpd_avx(auVar107,auVar107,3);
          auVar269 = vsubps_avx(auVar269,auVar74);
          auVar74 = vsubps_avx(auVar65,auVar203);
          auVar203 = vsubps_avx(auVar64,auVar75);
          auVar96 = vsubps_avx(auVar96,auVar107);
          auVar65 = vminps_avx(auVar269,auVar74);
          auVar269 = vmaxps_avx(auVar269,auVar74);
          auVar64 = vminps_avx(auVar203,auVar96);
          auVar64 = vminps_avx(auVar65,auVar64);
          auVar65 = vmaxps_avx(auVar203,auVar96);
          auVar269 = vmaxps_avx(auVar269,auVar65);
          auVar236._0_4_ = fVar151 * auVar64._0_4_;
          auVar236._4_4_ = fVar151 * auVar64._4_4_;
          auVar236._8_4_ = fVar151 * auVar64._8_4_;
          auVar236._12_4_ = fVar151 * auVar64._12_4_;
          auVar226._0_4_ = fVar151 * auVar269._0_4_;
          auVar226._4_4_ = fVar151 * auVar269._4_4_;
          auVar226._8_4_ = fVar151 * auVar269._8_4_;
          auVar226._12_4_ = fVar151 * auVar269._12_4_;
          auVar96 = vinsertps_avx(auVar9,auVar73,0x10);
          auVar74 = vinsertps_avx(auVar10,auVar120,0x10);
          auVar68._0_4_ = (auVar96._0_4_ + auVar74._0_4_) * 0.5;
          auVar68._4_4_ = (auVar96._4_4_ + auVar74._4_4_) * 0.5;
          auVar68._8_4_ = (auVar96._8_4_ + auVar74._8_4_) * 0.5;
          auVar68._12_4_ = (auVar96._12_4_ + auVar74._12_4_) * 0.5;
          auVar113._4_4_ = auVar68._0_4_;
          auVar113._0_4_ = auVar68._0_4_;
          auVar113._8_4_ = auVar68._0_4_;
          auVar113._12_4_ = auVar68._0_4_;
          auVar269 = vfmadd213ps_fma(local_3b0,auVar113,auVar11);
          auVar65 = vfmadd213ps_fma(local_3c0,auVar113,auVar12);
          auVar64 = vfmadd213ps_fma(local_3d0,auVar113,auVar13);
          auVar10 = vsubps_avx(auVar65,auVar269);
          auVar269 = vfmadd213ps_fma(auVar10,auVar113,auVar269);
          auVar10 = vsubps_avx(auVar64,auVar65);
          auVar10 = vfmadd213ps_fma(auVar10,auVar113,auVar65);
          auVar10 = vsubps_avx(auVar10,auVar269);
          auVar269 = vfmadd231ps_fma(auVar269,auVar10,auVar113);
          auVar114._0_8_ = CONCAT44(auVar10._4_4_ * 3.0,auVar10._0_4_ * 3.0);
          auVar114._8_4_ = auVar10._8_4_ * 3.0;
          auVar114._12_4_ = auVar10._12_4_ * 3.0;
          auVar221._8_8_ = auVar269._0_8_;
          auVar221._0_8_ = auVar269._0_8_;
          auVar10 = vshufpd_avx(auVar269,auVar269,3);
          auVar269 = vshufps_avx(auVar68,auVar68,0x55);
          auVar203 = vsubps_avx(auVar10,auVar221);
          auVar107 = vfmadd231ps_fma(auVar221,auVar269,auVar203);
          auVar258._8_8_ = auVar114._0_8_;
          auVar258._0_8_ = auVar114._0_8_;
          auVar10 = vshufpd_avx(auVar114,auVar114,3);
          auVar10 = vsubps_avx(auVar10,auVar258);
          auVar75 = vfmadd213ps_fma(auVar10,auVar269,auVar258);
          auVar269 = vmovshdup_avx(auVar75);
          auVar259._0_8_ = auVar269._0_8_ ^ 0x8000000080000000;
          auVar259._8_4_ = auVar269._8_4_ ^ 0x80000000;
          auVar259._12_4_ = auVar269._12_4_ ^ 0x80000000;
          auVar65 = vmovshdup_avx(auVar203);
          auVar10 = vunpcklps_avx(auVar65,auVar259);
          auVar64 = vshufps_avx(auVar10,auVar259,4);
          auVar276._0_8_ = auVar203._0_8_ ^ 0x8000000080000000;
          auVar276._8_4_ = auVar203._8_4_ ^ 0x80000000;
          auVar276._12_4_ = auVar203._12_4_ ^ 0x80000000;
          auVar10 = vmovlhps_avx(auVar276,auVar75);
          auVar10 = vshufps_avx(auVar10,auVar75,8);
          auVar269 = vfmsub231ss_fma(ZEXT416((uint)(auVar269._0_4_ * auVar203._0_4_)),auVar65,
                                     auVar75);
          auVar130._0_4_ = auVar269._0_4_;
          auVar130._4_4_ = auVar130._0_4_;
          auVar130._8_4_ = auVar130._0_4_;
          auVar130._12_4_ = auVar130._0_4_;
          auVar269 = vdivps_avx(auVar64,auVar130);
          auVar65 = vdivps_avx(auVar10,auVar130);
          fVar94 = auVar107._0_4_;
          fVar151 = auVar269._0_4_;
          auVar10 = vshufps_avx(auVar107,auVar107,0x55);
          fVar152 = auVar65._0_4_;
          local_6e0._4_4_ = fVar94 * auVar269._4_4_ + auVar10._4_4_ * auVar65._4_4_;
          local_6e0._0_4_ = fVar94 * fVar151 + auVar10._0_4_ * fVar152;
          uStack_6d8._0_4_ = fVar94 * auVar269._8_4_ + auVar10._8_4_ * auVar65._8_4_;
          uStack_6d8._4_4_ = fVar94 * auVar269._12_4_ + auVar10._12_4_ * auVar65._12_4_;
          auVar203 = vmovshdup_avx(auVar269);
          auVar10 = vinsertps_avx(auVar206,auVar236,0x1c);
          auVar270._0_4_ = auVar203._0_4_ * auVar10._0_4_;
          auVar270._4_4_ = auVar203._4_4_ * auVar10._4_4_;
          auVar270._8_4_ = auVar203._8_4_ * auVar10._8_4_;
          auVar270._12_4_ = auVar203._12_4_ * auVar10._12_4_;
          auVar64 = vinsertps_avx(auVar189,auVar226,0x1c);
          auVar245._0_4_ = auVar203._0_4_ * auVar64._0_4_;
          auVar245._4_4_ = auVar203._4_4_ * auVar64._4_4_;
          auVar245._8_4_ = auVar203._8_4_ * auVar64._8_4_;
          auVar245._12_4_ = auVar203._12_4_ * auVar64._12_4_;
          auVar121 = vminps_avx(auVar270,auVar245);
          auVar107 = vmaxps_avx(auVar245,auVar270);
          auVar203 = vinsertps_avx(auVar236,auVar206,0x4c);
          auVar125 = vmovshdup_avx(auVar65);
          auVar75 = vinsertps_avx(auVar226,auVar189,0x4c);
          auVar227._0_4_ = auVar125._0_4_ * auVar203._0_4_;
          auVar227._4_4_ = auVar125._4_4_ * auVar203._4_4_;
          auVar227._8_4_ = auVar125._8_4_ * auVar203._8_4_;
          auVar227._12_4_ = auVar125._12_4_ * auVar203._12_4_;
          auVar237._0_4_ = auVar125._0_4_ * auVar75._0_4_;
          auVar237._4_4_ = auVar125._4_4_ * auVar75._4_4_;
          auVar237._8_4_ = auVar125._8_4_ * auVar75._8_4_;
          auVar237._12_4_ = auVar125._12_4_ * auVar75._12_4_;
          auVar125 = vminps_avx(auVar227,auVar237);
          auVar85._0_4_ = auVar125._0_4_ + auVar121._0_4_;
          auVar85._4_4_ = auVar125._4_4_ + auVar121._4_4_;
          auVar85._8_4_ = auVar125._8_4_ + auVar121._8_4_;
          auVar85._12_4_ = auVar125._12_4_ + auVar121._12_4_;
          auVar121 = vmaxps_avx(auVar237,auVar227);
          auVar228._0_4_ = auVar107._0_4_ + auVar121._0_4_;
          auVar228._4_4_ = auVar107._4_4_ + auVar121._4_4_;
          auVar228._8_4_ = auVar107._8_4_ + auVar121._8_4_;
          auVar228._12_4_ = auVar107._12_4_ + auVar121._12_4_;
          auVar238._8_8_ = 0x3f80000000000000;
          auVar238._0_8_ = 0x3f80000000000000;
          auVar107 = vsubps_avx(auVar238,auVar228);
          auVar121 = vsubps_avx(auVar238,auVar85);
          auVar125 = vsubps_avx(auVar96,auVar68);
          auVar260._0_4_ = fVar151 * auVar10._0_4_;
          auVar260._4_4_ = fVar151 * auVar10._4_4_;
          auVar260._8_4_ = fVar151 * auVar10._8_4_;
          auVar260._12_4_ = fVar151 * auVar10._12_4_;
          auVar246._0_4_ = fVar151 * auVar64._0_4_;
          auVar246._4_4_ = fVar151 * auVar64._4_4_;
          auVar246._8_4_ = fVar151 * auVar64._8_4_;
          auVar246._12_4_ = fVar151 * auVar64._12_4_;
          auVar64 = vminps_avx(auVar260,auVar246);
          auVar10 = vmaxps_avx(auVar246,auVar260);
          auVar207._0_4_ = fVar152 * auVar203._0_4_;
          auVar207._4_4_ = fVar152 * auVar203._4_4_;
          auVar207._8_4_ = fVar152 * auVar203._8_4_;
          auVar207._12_4_ = fVar152 * auVar203._12_4_;
          auVar190._0_4_ = fVar152 * auVar75._0_4_;
          auVar190._4_4_ = fVar152 * auVar75._4_4_;
          auVar190._8_4_ = fVar152 * auVar75._8_4_;
          auVar190._12_4_ = fVar152 * auVar75._12_4_;
          auVar203 = vminps_avx(auVar207,auVar190);
          auVar261._0_4_ = auVar64._0_4_ + auVar203._0_4_;
          auVar261._4_4_ = auVar64._4_4_ + auVar203._4_4_;
          auVar261._8_4_ = auVar64._8_4_ + auVar203._8_4_;
          auVar261._12_4_ = auVar64._12_4_ + auVar203._12_4_;
          auVar203 = vsubps_avx(auVar74,auVar68);
          auVar64 = vmaxps_avx(auVar190,auVar207);
          fVar94 = auVar125._0_4_;
          auVar208._0_4_ = fVar94 * auVar107._0_4_;
          fVar95 = auVar125._4_4_;
          auVar208._4_4_ = fVar95 * auVar107._4_4_;
          fVar63 = auVar125._8_4_;
          auVar208._8_4_ = fVar63 * auVar107._8_4_;
          fVar177 = auVar125._12_4_;
          auVar208._12_4_ = fVar177 * auVar107._12_4_;
          auVar191._0_4_ = auVar10._0_4_ + auVar64._0_4_;
          auVar191._4_4_ = auVar10._4_4_ + auVar64._4_4_;
          auVar191._8_4_ = auVar10._8_4_ + auVar64._8_4_;
          auVar191._12_4_ = auVar10._12_4_ + auVar64._12_4_;
          auVar247._8_8_ = 0x3f800000;
          auVar247._0_8_ = 0x3f800000;
          auVar10 = vsubps_avx(auVar247,auVar191);
          auVar64 = vsubps_avx(auVar247,auVar261);
          auVar262._0_4_ = fVar94 * auVar121._0_4_;
          auVar262._4_4_ = fVar95 * auVar121._4_4_;
          auVar262._8_4_ = fVar63 * auVar121._8_4_;
          auVar262._12_4_ = fVar177 * auVar121._12_4_;
          fVar153 = auVar203._0_4_;
          auVar229._0_4_ = fVar153 * auVar107._0_4_;
          fVar154 = auVar203._4_4_;
          auVar229._4_4_ = fVar154 * auVar107._4_4_;
          fVar155 = auVar203._8_4_;
          auVar229._8_4_ = fVar155 * auVar107._8_4_;
          fVar156 = auVar203._12_4_;
          auVar229._12_4_ = fVar156 * auVar107._12_4_;
          auVar86._0_4_ = fVar153 * auVar121._0_4_;
          auVar86._4_4_ = fVar154 * auVar121._4_4_;
          auVar86._8_4_ = fVar155 * auVar121._8_4_;
          auVar86._12_4_ = fVar156 * auVar121._12_4_;
          auVar277._0_4_ = fVar94 * auVar10._0_4_;
          auVar277._4_4_ = fVar95 * auVar10._4_4_;
          auVar277._8_4_ = fVar63 * auVar10._8_4_;
          auVar277._12_4_ = fVar177 * auVar10._12_4_;
          auVar239._0_4_ = fVar94 * auVar64._0_4_;
          auVar239._4_4_ = fVar95 * auVar64._4_4_;
          auVar239._8_4_ = fVar63 * auVar64._8_4_;
          auVar239._12_4_ = fVar177 * auVar64._12_4_;
          auVar192._0_4_ = fVar153 * auVar10._0_4_;
          auVar192._4_4_ = fVar154 * auVar10._4_4_;
          auVar192._8_4_ = fVar155 * auVar10._8_4_;
          auVar192._12_4_ = fVar156 * auVar10._12_4_;
          auVar248._0_4_ = fVar153 * auVar64._0_4_;
          auVar248._4_4_ = fVar154 * auVar64._4_4_;
          auVar248._8_4_ = fVar155 * auVar64._8_4_;
          auVar248._12_4_ = fVar156 * auVar64._12_4_;
          auVar10 = vminps_avx(auVar277,auVar239);
          auVar64 = vminps_avx(auVar192,auVar248);
          auVar10 = vminps_avx(auVar10,auVar64);
          auVar64 = vmaxps_avx(auVar239,auVar277);
          auVar203 = vminps_avx(auVar208,auVar262);
          auVar75 = vminps_avx(auVar229,auVar86);
          auVar203 = vminps_avx(auVar203,auVar75);
          auVar10 = vhaddps_avx(auVar10,auVar203);
          auVar203 = vmaxps_avx(auVar248,auVar192);
          auVar64 = vmaxps_avx(auVar203,auVar64);
          auVar203 = vmaxps_avx(auVar262,auVar208);
          auVar75 = vmaxps_avx(auVar86,auVar229);
          auVar203 = vmaxps_avx(auVar75,auVar203);
          auVar64 = vhaddps_avx(auVar64,auVar203);
          auVar203 = vshufps_avx(auVar68,auVar68,0x54);
          auVar203 = vsubps_avx(auVar203,_local_6e0);
          auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
          auVar64 = vshufps_avx(auVar64,auVar64,0xe8);
          auVar209._0_4_ = auVar203._0_4_ + auVar10._0_4_;
          auVar209._4_4_ = auVar203._4_4_ + auVar10._4_4_;
          auVar209._8_4_ = auVar203._8_4_ + auVar10._8_4_;
          auVar209._12_4_ = auVar203._12_4_ + auVar10._12_4_;
          auVar193._0_4_ = auVar203._0_4_ + auVar64._0_4_;
          auVar193._4_4_ = auVar203._4_4_ + auVar64._4_4_;
          auVar193._8_4_ = auVar203._8_4_ + auVar64._8_4_;
          auVar193._12_4_ = auVar203._12_4_ + auVar64._12_4_;
          auVar10 = vmaxps_avx(auVar96,auVar209);
          auVar64 = vminps_avx(auVar193,auVar74);
          auVar10 = vcmpps_avx(auVar64,auVar10,1);
          auVar10 = vshufps_avx(auVar10,auVar10,0x50);
          local_780 = vinsertps_avx(auVar73,ZEXT416((uint)auVar120._0_4_),0x10);
          if ((auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar10[0xf] < '\0') goto LAB_016857fe;
          bVar57 = 0;
          if ((auVar175._0_4_ < auVar209._0_4_) && (bVar57 = 0, auVar193._0_4_ < auVar74._0_4_)) {
            auVar64 = vmovshdup_avx(auVar209);
            auVar10 = vcmpps_avx(auVar193,auVar74,1);
            bVar57 = auVar10[4] & auVar73._0_4_ < auVar64._0_4_;
          }
          if (((3 < (uint)uVar54 || fVar134 < 0.001) | bVar57) == 1) {
            lVar56 = 200;
            do {
              fVar63 = auVar203._0_4_;
              fVar95 = 1.0 - fVar63;
              fVar134 = fVar95 * fVar95 * fVar95;
              fVar94 = fVar63 * 3.0 * fVar95 * fVar95;
              fVar95 = fVar95 * fVar63 * fVar63 * 3.0;
              auVar147._4_4_ = fVar134;
              auVar147._0_4_ = fVar134;
              auVar147._8_4_ = fVar134;
              auVar147._12_4_ = fVar134;
              auVar103._4_4_ = fVar94;
              auVar103._0_4_ = fVar94;
              auVar103._8_4_ = fVar94;
              auVar103._12_4_ = fVar94;
              auVar87._4_4_ = fVar95;
              auVar87._0_4_ = fVar95;
              auVar87._8_4_ = fVar95;
              auVar87._12_4_ = fVar95;
              fVar63 = fVar63 * fVar63 * fVar63;
              auVar170._0_4_ = (float)local_580._0_4_ * fVar63;
              auVar170._4_4_ = (float)local_580._4_4_ * fVar63;
              auVar170._8_4_ = fStack_578 * fVar63;
              auVar170._12_4_ = fStack_574 * fVar63;
              auVar10 = vfmadd231ps_fma(auVar170,auVar13,auVar87);
              auVar10 = vfmadd231ps_fma(auVar10,auVar12,auVar103);
              auVar10 = vfmadd231ps_fma(auVar10,auVar11,auVar147);
              auVar88._8_8_ = auVar10._0_8_;
              auVar88._0_8_ = auVar10._0_8_;
              auVar10 = vshufpd_avx(auVar10,auVar10,3);
              auVar64 = vshufps_avx(auVar203,auVar203,0x55);
              auVar10 = vsubps_avx(auVar10,auVar88);
              auVar64 = vfmadd213ps_fma(auVar10,auVar64,auVar88);
              fVar134 = auVar64._0_4_;
              auVar10 = vshufps_avx(auVar64,auVar64,0x55);
              auVar89._0_4_ = fVar151 * fVar134 + fVar152 * auVar10._0_4_;
              auVar89._4_4_ = auVar269._4_4_ * fVar134 + auVar65._4_4_ * auVar10._4_4_;
              auVar89._8_4_ = auVar269._8_4_ * fVar134 + auVar65._8_4_ * auVar10._8_4_;
              auVar89._12_4_ = auVar269._12_4_ * fVar134 + auVar65._12_4_ * auVar10._12_4_;
              auVar203 = vsubps_avx(auVar203,auVar89);
              auVar10 = vandps_avx(auVar274,auVar64);
              auVar64 = vshufps_avx(auVar10,auVar10,0xf5);
              auVar10 = vmaxss_avx(auVar64,auVar10);
              if (auVar10._0_4_ < (float)local_3e0._0_4_) {
                local_120 = auVar203._0_4_;
                if ((0.0 <= local_120) && (local_120 <= 1.0)) {
                  auVar10 = vmovshdup_avx(auVar203);
                  fVar134 = auVar10._0_4_;
                  if ((0.0 <= fVar134) && (fVar134 <= 1.0)) {
                    auVar269 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                             ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                             0x1c);
                    auVar121 = vinsertps_avx(auVar269,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                    m128[2]),0x28);
                    auVar269 = vdpps_avx(auVar121,local_590,0x7f);
                    auVar65 = vdpps_avx(auVar121,local_5a0,0x7f);
                    auVar64 = vdpps_avx(auVar121,local_3f0,0x7f);
                    auVar96 = vdpps_avx(auVar121,local_400,0x7f);
                    auVar74 = vdpps_avx(auVar121,local_410,0x7f);
                    auVar75 = vdpps_avx(auVar121,local_420,0x7f);
                    auVar107 = vdpps_avx(auVar121,local_430,0x7f);
                    auVar121 = vdpps_avx(auVar121,local_440,0x7f);
                    fVar151 = 1.0 - fVar134;
                    auVar269 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * auVar74._0_4_)),
                                               ZEXT416((uint)fVar151),auVar269);
                    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar134)),
                                              ZEXT416((uint)fVar151),auVar65);
                    auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar107._0_4_ * fVar134)),
                                              ZEXT416((uint)fVar151),auVar64);
                    auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * auVar121._0_4_)),
                                              ZEXT416((uint)fVar151),auVar96);
                    fVar95 = 1.0 - local_120;
                    fVar151 = fVar95 * local_120 * local_120 * 3.0;
                    fVar177 = local_120 * local_120 * local_120;
                    auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar177 * auVar96._0_4_)),
                                              ZEXT416((uint)fVar151),auVar64);
                    fVar152 = local_120 * 3.0 * fVar95 * fVar95;
                    auVar65 = vfmadd231ss_fma(auVar64,ZEXT416((uint)fVar152),auVar65);
                    fVar94 = fVar95 * fVar95 * fVar95;
                    auVar269 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar94),auVar269);
                    auVar70 = ZEXT1632(auVar269);
                    fVar63 = auVar269._0_4_;
                    if (((fVar61 <= fVar63) &&
                        (fVar153 = *(float *)(ray + k * 4 + 0x100), fVar63 <= fVar153)) &&
                       (pGVar5 = (context->scene->geometries).items[uVar50].ptr,
                       (pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                      auVar65 = vshufps_avx(auVar203,auVar203,0x55);
                      auVar222._8_4_ = 0x3f800000;
                      auVar222._0_8_ = &DAT_3f8000003f800000;
                      auVar222._12_4_ = 0x3f800000;
                      auVar64 = vsubps_avx(auVar222,auVar65);
                      fVar154 = auVar65._0_4_;
                      auVar230._0_4_ = fVar154 * (float)local_5c0._0_4_;
                      fVar155 = auVar65._4_4_;
                      auVar230._4_4_ = fVar155 * (float)local_5c0._4_4_;
                      fVar156 = auVar65._8_4_;
                      auVar230._8_4_ = fVar156 * fStack_5b8;
                      fVar176 = auVar65._12_4_;
                      auVar230._12_4_ = fVar176 * fStack_5b4;
                      auVar240._0_4_ = fVar154 * (float)local_610._0_4_;
                      auVar240._4_4_ = fVar155 * (float)local_610._4_4_;
                      auVar240._8_4_ = fVar156 * fStack_608;
                      auVar240._12_4_ = fVar176 * fStack_604;
                      auVar249._0_4_ = fVar154 * (float)local_620._0_4_;
                      auVar249._4_4_ = fVar155 * (float)local_620._4_4_;
                      auVar249._8_4_ = fVar156 * fStack_618;
                      auVar249._12_4_ = fVar176 * fStack_614;
                      auVar210._0_4_ = fVar154 * (float)local_5e0._0_4_;
                      auVar210._4_4_ = fVar155 * (float)local_5e0._4_4_;
                      auVar210._8_4_ = fVar156 * fStack_5d8;
                      auVar210._12_4_ = fVar176 * fStack_5d4;
                      auVar65 = vfmadd231ps_fma(auVar230,auVar64,local_5b0);
                      auVar96 = vfmadd231ps_fma(auVar240,auVar64,local_5f0);
                      auVar74 = vfmadd231ps_fma(auVar249,auVar64,local_600);
                      auVar203 = vfmadd231ps_fma(auVar210,auVar64,local_5d0);
                      auVar65 = vsubps_avx(auVar96,auVar65);
                      auVar64 = vsubps_avx(auVar74,auVar96);
                      auVar96 = vsubps_avx(auVar203,auVar74);
                      auVar250._0_4_ = local_120 * auVar64._0_4_;
                      auVar250._4_4_ = local_120 * auVar64._4_4_;
                      auVar250._8_4_ = local_120 * auVar64._8_4_;
                      auVar250._12_4_ = local_120 * auVar64._12_4_;
                      auVar194._4_4_ = fVar95;
                      auVar194._0_4_ = fVar95;
                      auVar194._8_4_ = fVar95;
                      auVar194._12_4_ = fVar95;
                      auVar65 = vfmadd231ps_fma(auVar250,auVar194,auVar65);
                      auVar211._0_4_ = local_120 * auVar96._0_4_;
                      auVar211._4_4_ = local_120 * auVar96._4_4_;
                      auVar211._8_4_ = local_120 * auVar96._8_4_;
                      auVar211._12_4_ = local_120 * auVar96._12_4_;
                      auVar64 = vfmadd231ps_fma(auVar211,auVar194,auVar64);
                      auVar212._0_4_ = local_120 * auVar64._0_4_;
                      auVar212._4_4_ = local_120 * auVar64._4_4_;
                      auVar212._8_4_ = local_120 * auVar64._8_4_;
                      auVar212._12_4_ = local_120 * auVar64._12_4_;
                      auVar64 = vfmadd231ps_fma(auVar212,auVar194,auVar65);
                      auVar171._0_4_ = fVar177 * (float)local_490._0_4_;
                      auVar171._4_4_ = fVar177 * (float)local_490._4_4_;
                      auVar171._8_4_ = fVar177 * fStack_488;
                      auVar171._12_4_ = fVar177 * fStack_484;
                      auVar115._4_4_ = fVar151;
                      auVar115._0_4_ = fVar151;
                      auVar115._8_4_ = fVar151;
                      auVar115._12_4_ = fVar151;
                      auVar65 = vfmadd132ps_fma(auVar115,auVar171,local_480);
                      auVar148._4_4_ = fVar152;
                      auVar148._0_4_ = fVar152;
                      auVar148._8_4_ = fVar152;
                      auVar148._12_4_ = fVar152;
                      auVar65 = vfmadd132ps_fma(auVar148,auVar65,local_470);
                      auVar172._0_4_ = auVar64._0_4_ * 3.0;
                      auVar172._4_4_ = auVar64._4_4_ * 3.0;
                      auVar172._8_4_ = auVar64._8_4_ * 3.0;
                      auVar172._12_4_ = auVar64._12_4_ * 3.0;
                      auVar131._4_4_ = fVar94;
                      auVar131._0_4_ = fVar94;
                      auVar131._8_4_ = fVar94;
                      auVar131._12_4_ = fVar94;
                      auVar64 = vfmadd132ps_fma(auVar131,auVar65,local_460);
                      auVar65 = vshufps_avx(auVar172,auVar172,0xc9);
                      auVar116._0_4_ = auVar64._0_4_ * auVar65._0_4_;
                      auVar116._4_4_ = auVar64._4_4_ * auVar65._4_4_;
                      auVar116._8_4_ = auVar64._8_4_ * auVar65._8_4_;
                      auVar116._12_4_ = auVar64._12_4_ * auVar65._12_4_;
                      auVar65 = vshufps_avx(auVar64,auVar64,0xc9);
                      auVar65 = vfmsub231ps_fma(auVar116,auVar172,auVar65);
                      local_140 = auVar65._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar63;
                        uVar62 = vextractps_avx(auVar65,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar62;
                        uVar62 = vextractps_avx(auVar65,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar62;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                        *(float *)(ray + k * 4 + 0x1e0) = local_120;
                        *(float *)(ray + k * 4 + 0x200) = fVar134;
                        *(uint *)(ray + k * 4 + 0x220) = uVar4;
                        *(uint *)(ray + k * 4 + 0x240) = uVar50;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        local_100._0_8_ = auVar10._0_8_;
                        local_100._8_8_ = local_100._0_8_;
                        local_100._16_8_ = local_100._0_8_;
                        local_100._24_8_ = local_100._0_8_;
                        auVar10 = vmovshdup_avx(auVar65);
                        local_180 = auVar10._0_8_;
                        auVar10 = vshufps_avx(auVar65,auVar65,0xaa);
                        local_160 = auVar10._0_8_;
                        uStack_178 = local_180;
                        uStack_170 = local_180;
                        uStack_168 = local_180;
                        uStack_158 = local_160;
                        uStack_150 = local_160;
                        uStack_148 = local_160;
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_e0 = CONCAT44(uStack_33c,local_340);
                        uStack_d8 = CONCAT44(uStack_334,uStack_338);
                        uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                        uStack_c8 = CONCAT44(uStack_324,uStack_328);
                        local_c0 = CONCAT44(uStack_31c,local_320);
                        uStack_b8 = CONCAT44(uStack_314,uStack_318);
                        uStack_b0 = CONCAT44(uStack_30c,uStack_310);
                        uStack_a8 = CONCAT44(uStack_304,uStack_308);
                        auVar15 = vpcmpeqd_avx2(local_100,local_100);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = fVar63;
                        local_4c0 = local_360._0_8_;
                        uStack_4b8 = local_360._8_8_;
                        uStack_4b0 = local_360._16_8_;
                        uStack_4a8 = local_360._24_8_;
                        local_650.valid = (int *)&local_4c0;
                        local_650.geometryUserPtr = pGVar5->userPtr;
                        local_650.context = context->user;
                        local_650.hit = (RTCHitN *)&local_180;
                        local_650.N = 8;
                        local_650.ray = (RTCRayN *)ray;
                        if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar70 = ZEXT1632(auVar269);
                          (*pGVar5->intersectionFilterN)(&local_650);
                          auVar93._8_56_ = extraout_var;
                          auVar93._0_8_ = extraout_XMM1_Qa;
                          auVar15 = vpcmpeqd_avx2(auVar93._0_32_,auVar93._0_32_);
                        }
                        auVar45._8_8_ = uStack_4b8;
                        auVar45._0_8_ = local_4c0;
                        auVar45._16_8_ = uStack_4b0;
                        auVar45._24_8_ = uStack_4a8;
                        auVar72 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar45);
                        auVar71 = auVar15 & ~auVar72;
                        if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar71 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar71 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar71 >> 0x7f,0) == '\0') &&
                              (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar71 >> 0xbf,0) == '\0') &&
                            (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar71[0x1f]) {
                          auVar72 = auVar72 ^ auVar15;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar70 = ZEXT1632(auVar70._0_16_);
                            (*p_Var6)(&local_650);
                          }
                          auVar46._8_8_ = uStack_4b8;
                          auVar46._0_8_ = local_4c0;
                          auVar46._16_8_ = uStack_4b0;
                          auVar46._24_8_ = uStack_4a8;
                          auVar15 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar46
                                                 );
                          auVar71 = vpcmpeqd_avx2(auVar70,auVar70);
                          auVar72 = auVar15 ^ auVar71;
                          auVar70 = auVar71 & ~auVar15;
                          if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar70 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar70 >> 0x7f,0) != '\0') ||
                                (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar70 >> 0xbf,0) != '\0') ||
                              (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar70[0x1f] < '\0') {
                            auVar92._0_4_ = auVar15._0_4_ ^ auVar71._0_4_;
                            auVar92._4_4_ = auVar15._4_4_ ^ auVar71._4_4_;
                            auVar92._8_4_ = auVar15._8_4_ ^ auVar71._8_4_;
                            auVar92._12_4_ = auVar15._12_4_ ^ auVar71._12_4_;
                            auVar92._16_4_ = auVar15._16_4_ ^ auVar71._16_4_;
                            auVar92._20_4_ = auVar15._20_4_ ^ auVar71._20_4_;
                            auVar92._24_4_ = auVar15._24_4_ ^ auVar71._24_4_;
                            auVar92._28_4_ = auVar15._28_4_ ^ auVar71._28_4_;
                            auVar70 = vmaskmovps_avx(auVar92,*(undefined1 (*) [32])local_650.hit);
                            *(undefined1 (*) [32])(local_650.ray + 0x180) = auVar70;
                            auVar70 = vmaskmovps_avx(auVar92,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x20));
                            *(undefined1 (*) [32])(local_650.ray + 0x1a0) = auVar70;
                            auVar70 = vmaskmovps_avx(auVar92,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x40));
                            *(undefined1 (*) [32])(local_650.ray + 0x1c0) = auVar70;
                            auVar70 = vmaskmovps_avx(auVar92,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x60));
                            *(undefined1 (*) [32])(local_650.ray + 0x1e0) = auVar70;
                            auVar70 = vmaskmovps_avx(auVar92,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x80));
                            *(undefined1 (*) [32])(local_650.ray + 0x200) = auVar70;
                            auVar70 = vpmaskmovd_avx2(auVar92,*(undefined1 (*) [32])
                                                               (local_650.hit + 0xa0));
                            *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar70;
                            auVar70 = vpmaskmovd_avx2(auVar92,*(undefined1 (*) [32])
                                                               (local_650.hit + 0xc0));
                            *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar70;
                            auVar70 = vpmaskmovd_avx2(auVar92,*(undefined1 (*) [32])
                                                               (local_650.hit + 0xe0));
                            *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar70;
                            auVar70 = vpmaskmovd_avx2(auVar92,*(undefined1 (*) [32])
                                                               (local_650.hit + 0x100));
                            *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar70;
                          }
                        }
                        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar72 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar72 >> 0x7f,0) == '\0') &&
                              (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar72 >> 0xbf,0) == '\0') &&
                            (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar72[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar153;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar56 = lVar56 + -1;
            } while (lVar56 != 0);
          }
          else {
            bVar42 = false;
          }
        }
      }
    } while (bVar42);
    local_450 = vinsertps_avx(auVar9,ZEXT416((uint)fVar150),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }